

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx2::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [12];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  uint uVar73;
  ulong uVar74;
  undefined1 (*pauVar75) [32];
  uint uVar76;
  uint uVar77;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  long lVar78;
  long lVar79;
  uint uVar80;
  int iVar81;
  ulong uVar82;
  undefined4 uVar83;
  undefined8 uVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar88 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar109;
  float fVar130;
  float fVar131;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar136 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar137 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar175;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar176;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar196;
  float fVar208;
  float fVar209;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  float fVar235;
  float fVar240;
  undefined1 auVar236 [16];
  float fVar238;
  float fVar239;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 in_ZMM10 [64];
  undefined1 auVar237 [64];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar244 [32];
  float fVar250;
  float fVar251;
  undefined1 in_ZMM11 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_aec;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  RTCFilterFunctionNArguments local_a78;
  int local_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined8 local_8f0;
  float local_8e8;
  float local_8e4;
  undefined4 local_8e0;
  uint local_8dc;
  uint local_8d8;
  uint local_8d4;
  uint local_8d0;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 auStack_790 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined4 uStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined4 uStack_564;
  undefined1 local_560 [32];
  uint local_540;
  uint uStack_53c;
  uint uStack_538;
  uint uStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  uint uStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_430 [16];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar7 = prim[1];
  uVar74 = (ulong)(byte)PVar7;
  lVar79 = uVar74 * 0x25;
  fVar109 = *(float *)(prim + lVar79 + 0x12);
  auVar90 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar79 + 6));
  auVar136._0_4_ = fVar109 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar136._4_4_ = fVar109 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar136._8_4_ = fVar109 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar136._12_4_ = fVar109 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar85._0_4_ = fVar109 * auVar90._0_4_;
  auVar85._4_4_ = fVar109 * auVar90._4_4_;
  auVar85._8_4_ = fVar109 * auVar90._8_4_;
  auVar85._12_4_ = fVar109 * auVar90._12_4_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar74 * 4 + 6);
  auVar127 = vpmovsxbd_avx2(auVar90);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar74 * 5 + 6);
  auVar97 = vpmovsxbd_avx2(auVar4);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *(ulong *)(prim + uVar74 * 6 + 6);
  auVar14 = vpmovsxbd_avx2(auVar182);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar74 * 0xf + 6);
  auVar147 = vpmovsxbd_avx2(auVar141);
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar15 = vpmovsxbd_avx2(auVar202);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar74 + 6);
  auVar16 = vpmovsxbd_avx2(auVar94);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + uVar74 * 0x1a + 6);
  auVar17 = vpmovsxbd_avx2(auVar220);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar74 * 0x1b + 6);
  auVar18 = vpmovsxbd_avx2(auVar5);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar74 * 0x1c + 6);
  auVar19 = vpmovsxbd_avx2(auVar6);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar224._4_4_ = auVar136._0_4_;
  auVar224._0_4_ = auVar136._0_4_;
  auVar224._8_4_ = auVar136._0_4_;
  auVar224._12_4_ = auVar136._0_4_;
  auVar224._16_4_ = auVar136._0_4_;
  auVar224._20_4_ = auVar136._0_4_;
  auVar224._24_4_ = auVar136._0_4_;
  auVar224._28_4_ = auVar136._0_4_;
  auVar90 = vmovshdup_avx(auVar136);
  uVar84 = auVar90._0_8_;
  auVar262._8_8_ = uVar84;
  auVar262._0_8_ = uVar84;
  auVar262._16_8_ = uVar84;
  auVar262._24_8_ = uVar84;
  auVar90 = vshufps_avx(auVar136,auVar136,0xaa);
  fVar109 = auVar90._0_4_;
  auVar231._0_4_ = fVar109 * auVar14._0_4_;
  fVar130 = auVar90._4_4_;
  auVar231._4_4_ = fVar130 * auVar14._4_4_;
  auVar231._8_4_ = fVar109 * auVar14._8_4_;
  auVar231._12_4_ = fVar130 * auVar14._12_4_;
  auVar231._16_4_ = fVar109 * auVar14._16_4_;
  auVar231._20_4_ = fVar130 * auVar14._20_4_;
  auVar231._28_36_ = in_ZMM11._28_36_;
  auVar231._24_4_ = fVar109 * auVar14._24_4_;
  auVar223._0_4_ = auVar16._0_4_ * fVar109;
  auVar223._4_4_ = auVar16._4_4_ * fVar130;
  auVar223._8_4_ = auVar16._8_4_ * fVar109;
  auVar223._12_4_ = auVar16._12_4_ * fVar130;
  auVar223._16_4_ = auVar16._16_4_ * fVar109;
  auVar223._20_4_ = auVar16._20_4_ * fVar130;
  auVar223._28_36_ = in_ZMM10._28_36_;
  auVar223._24_4_ = auVar16._24_4_ * fVar109;
  auVar233._0_4_ = auVar19._0_4_ * fVar109;
  auVar233._4_4_ = auVar19._4_4_ * fVar130;
  auVar233._8_4_ = auVar19._8_4_ * fVar109;
  auVar233._12_4_ = auVar19._12_4_ * fVar130;
  auVar233._16_4_ = auVar19._16_4_ * fVar109;
  auVar233._20_4_ = auVar19._20_4_ * fVar130;
  auVar233._24_4_ = auVar19._24_4_ * fVar109;
  auVar233._28_4_ = 0;
  auVar90 = vfmadd231ps_fma(auVar231._0_32_,auVar262,auVar97);
  auVar4 = vfmadd231ps_fma(auVar223._0_32_,auVar262,auVar15);
  auVar182 = vfmadd231ps_fma(auVar233,auVar18,auVar262);
  auVar141 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar224,auVar127);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar224,auVar147);
  auVar182 = vfmadd231ps_fma(ZEXT1632(auVar182),auVar17,auVar224);
  auVar225._4_4_ = auVar85._0_4_;
  auVar225._0_4_ = auVar85._0_4_;
  auVar225._8_4_ = auVar85._0_4_;
  auVar225._12_4_ = auVar85._0_4_;
  auVar225._16_4_ = auVar85._0_4_;
  auVar225._20_4_ = auVar85._0_4_;
  auVar225._24_4_ = auVar85._0_4_;
  auVar225._28_4_ = auVar85._0_4_;
  auVar90 = vmovshdup_avx(auVar85);
  uVar84 = auVar90._0_8_;
  auVar263._8_8_ = uVar84;
  auVar263._0_8_ = uVar84;
  auVar263._16_8_ = uVar84;
  auVar263._24_8_ = uVar84;
  auVar90 = vshufps_avx(auVar85,auVar85,0xaa);
  fVar109 = auVar90._0_4_;
  auVar143._0_4_ = fVar109 * auVar14._0_4_;
  fVar130 = auVar90._4_4_;
  auVar143._4_4_ = fVar130 * auVar14._4_4_;
  auVar143._8_4_ = fVar109 * auVar14._8_4_;
  auVar143._12_4_ = fVar130 * auVar14._12_4_;
  auVar143._16_4_ = fVar109 * auVar14._16_4_;
  auVar143._20_4_ = fVar130 * auVar14._20_4_;
  auVar143._24_4_ = fVar109 * auVar14._24_4_;
  auVar143._28_4_ = 0;
  auVar98._4_4_ = auVar16._4_4_ * fVar130;
  auVar98._0_4_ = auVar16._0_4_ * fVar109;
  auVar98._8_4_ = auVar16._8_4_ * fVar109;
  auVar98._12_4_ = auVar16._12_4_ * fVar130;
  auVar98._16_4_ = auVar16._16_4_ * fVar109;
  auVar98._20_4_ = auVar16._20_4_ * fVar130;
  auVar98._24_4_ = auVar16._24_4_ * fVar109;
  auVar98._28_4_ = auVar14._28_4_;
  auVar14._4_4_ = auVar19._4_4_ * fVar130;
  auVar14._0_4_ = auVar19._0_4_ * fVar109;
  auVar14._8_4_ = auVar19._8_4_ * fVar109;
  auVar14._12_4_ = auVar19._12_4_ * fVar130;
  auVar14._16_4_ = auVar19._16_4_ * fVar109;
  auVar14._20_4_ = auVar19._20_4_ * fVar130;
  auVar14._24_4_ = auVar19._24_4_ * fVar109;
  auVar14._28_4_ = fVar130;
  auVar90 = vfmadd231ps_fma(auVar143,auVar263,auVar97);
  auVar202 = vfmadd231ps_fma(auVar98,auVar263,auVar15);
  auVar94 = vfmadd231ps_fma(auVar14,auVar263,auVar18);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar225,auVar127);
  local_720._8_4_ = 0x7fffffff;
  local_720._0_8_ = 0x7fffffff7fffffff;
  local_720._12_4_ = 0x7fffffff;
  local_720._16_4_ = 0x7fffffff;
  local_720._20_4_ = 0x7fffffff;
  local_720._24_4_ = 0x7fffffff;
  local_720._28_4_ = 0x7fffffff;
  auVar255._8_4_ = 0x219392ef;
  auVar255._0_8_ = 0x219392ef219392ef;
  auVar255._12_4_ = 0x219392ef;
  auVar255._16_4_ = 0x219392ef;
  auVar255._20_4_ = 0x219392ef;
  auVar255._24_4_ = 0x219392ef;
  auVar255._28_4_ = 0x219392ef;
  auVar127 = vandps_avx(ZEXT1632(auVar141),local_720);
  auVar127 = vcmpps_avx(auVar127,auVar255,1);
  auVar97 = vblendvps_avx(ZEXT1632(auVar141),auVar255,auVar127);
  auVar127 = vandps_avx(ZEXT1632(auVar4),local_720);
  auVar127 = vcmpps_avx(auVar127,auVar255,1);
  auVar14 = vblendvps_avx(ZEXT1632(auVar4),auVar255,auVar127);
  auVar127 = vandps_avx(ZEXT1632(auVar182),local_720);
  auVar127 = vcmpps_avx(auVar127,auVar255,1);
  auVar127 = vblendvps_avx(ZEXT1632(auVar182),auVar255,auVar127);
  auVar136 = vfmadd231ps_fma(ZEXT1632(auVar202),auVar225,auVar147);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar225,auVar17);
  fVar109 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar79 + 0x16)) *
            *(float *)(prim + lVar79 + 0x1a);
  auVar170._4_4_ = fVar109;
  auVar170._0_4_ = fVar109;
  auVar170._8_4_ = fVar109;
  auVar170._12_4_ = fVar109;
  auVar170._16_4_ = fVar109;
  auVar170._20_4_ = fVar109;
  auVar170._24_4_ = fVar109;
  auVar170._28_4_ = fVar109;
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 7 + 6));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0xb + 6));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar147);
  auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 9 + 6));
  auVar141 = vfmadd213ps_fma(auVar15,auVar170,auVar147);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0xd + 6));
  auVar147 = vcvtdq2ps_avx(auVar16);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar147);
  auVar202 = vfmadd213ps_fma(auVar15,auVar170,auVar147);
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0x12 + 6));
  auVar147 = vcvtdq2ps_avx(auVar147);
  uVar82 = (ulong)(uint)((int)(uVar74 * 5) << 2);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 2 + uVar82 + 6));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar147);
  auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar82 + 6));
  auVar94 = vfmadd213ps_fma(auVar15,auVar170,auVar147);
  auVar147 = vcvtdq2ps_avx(auVar16);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0x18 + 6));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar147);
  auVar220 = vfmadd213ps_fma(auVar15,auVar170,auVar147);
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0x1d + 6));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 + (ulong)(byte)PVar7 * 0x20 + 6));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar147);
  auVar5 = vfmadd213ps_fma(auVar15,auVar170,auVar147);
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar7 * 0x20 - uVar74) + 6))
  ;
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 * 0x23 + 6));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar147);
  auVar6 = vfmadd213ps_fma(auVar15,auVar170,auVar147);
  auVar147 = vrcpps_avx(auVar97);
  auVar252._8_4_ = 0x3f800000;
  auVar252._0_8_ = 0x3f8000003f800000;
  auVar252._12_4_ = 0x3f800000;
  auVar252._16_4_ = 0x3f800000;
  auVar252._20_4_ = 0x3f800000;
  auVar252._24_4_ = 0x3f800000;
  auVar252._28_4_ = 0x3f800000;
  auVar90 = vfnmadd213ps_fma(auVar97,auVar147,auVar252);
  auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar147,auVar147);
  auVar97 = vrcpps_avx(auVar14);
  auVar4 = vfnmadd213ps_fma(auVar14,auVar97,auVar252);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar97,auVar97);
  auVar97 = vrcpps_avx(auVar127);
  auVar182 = vfnmadd213ps_fma(auVar127,auVar97,auVar252);
  auVar182 = vfmadd132ps_fma(ZEXT1632(auVar182),auVar97,auVar97);
  auVar127 = vsubps_avx(ZEXT1632(auVar141),ZEXT1632(auVar85));
  auVar97 = vsubps_avx(ZEXT1632(auVar202),ZEXT1632(auVar85));
  auVar147._4_4_ = auVar90._4_4_ * auVar127._4_4_;
  auVar147._0_4_ = auVar90._0_4_ * auVar127._0_4_;
  auVar147._8_4_ = auVar90._8_4_ * auVar127._8_4_;
  auVar147._12_4_ = auVar90._12_4_ * auVar127._12_4_;
  auVar147._16_4_ = auVar127._16_4_ * 0.0;
  auVar147._20_4_ = auVar127._20_4_ * 0.0;
  auVar147._24_4_ = auVar127._24_4_ * 0.0;
  auVar147._28_4_ = auVar127._28_4_;
  auVar15._4_4_ = auVar90._4_4_ * auVar97._4_4_;
  auVar15._0_4_ = auVar90._0_4_ * auVar97._0_4_;
  auVar15._8_4_ = auVar90._8_4_ * auVar97._8_4_;
  auVar15._12_4_ = auVar90._12_4_ * auVar97._12_4_;
  auVar15._16_4_ = auVar97._16_4_ * 0.0;
  auVar15._20_4_ = auVar97._20_4_ * 0.0;
  auVar15._24_4_ = auVar97._24_4_ * 0.0;
  auVar15._28_4_ = auVar97._28_4_;
  auVar127 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar136));
  auVar97 = vsubps_avx(ZEXT1632(auVar220),ZEXT1632(auVar136));
  auVar16._4_4_ = auVar4._4_4_ * auVar127._4_4_;
  auVar16._0_4_ = auVar4._0_4_ * auVar127._0_4_;
  auVar16._8_4_ = auVar4._8_4_ * auVar127._8_4_;
  auVar16._12_4_ = auVar4._12_4_ * auVar127._12_4_;
  auVar16._16_4_ = auVar127._16_4_ * 0.0;
  auVar16._20_4_ = auVar127._20_4_ * 0.0;
  auVar16._24_4_ = auVar127._24_4_ * 0.0;
  auVar16._28_4_ = auVar127._28_4_;
  auVar17._4_4_ = auVar4._4_4_ * auVar97._4_4_;
  auVar17._0_4_ = auVar4._0_4_ * auVar97._0_4_;
  auVar17._8_4_ = auVar4._8_4_ * auVar97._8_4_;
  auVar17._12_4_ = auVar4._12_4_ * auVar97._12_4_;
  auVar17._16_4_ = auVar97._16_4_ * 0.0;
  auVar17._20_4_ = auVar97._20_4_ * 0.0;
  auVar17._24_4_ = auVar97._24_4_ * 0.0;
  auVar17._28_4_ = auVar97._28_4_;
  auVar127 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar86));
  auVar18._4_4_ = auVar182._4_4_ * auVar127._4_4_;
  auVar18._0_4_ = auVar182._0_4_ * auVar127._0_4_;
  auVar18._8_4_ = auVar182._8_4_ * auVar127._8_4_;
  auVar18._12_4_ = auVar182._12_4_ * auVar127._12_4_;
  auVar18._16_4_ = auVar127._16_4_ * 0.0;
  auVar18._20_4_ = auVar127._20_4_ * 0.0;
  auVar18._24_4_ = auVar127._24_4_ * 0.0;
  auVar18._28_4_ = auVar127._28_4_;
  auVar127 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar86));
  auVar19._4_4_ = auVar182._4_4_ * auVar127._4_4_;
  auVar19._0_4_ = auVar182._0_4_ * auVar127._0_4_;
  auVar19._8_4_ = auVar182._8_4_ * auVar127._8_4_;
  auVar19._12_4_ = auVar182._12_4_ * auVar127._12_4_;
  auVar19._16_4_ = auVar127._16_4_ * 0.0;
  auVar19._20_4_ = auVar127._20_4_ * 0.0;
  auVar19._24_4_ = auVar127._24_4_ * 0.0;
  auVar19._28_4_ = auVar127._28_4_;
  auVar127 = vpminsd_avx2(auVar147,auVar15);
  auVar97 = vpminsd_avx2(auVar16,auVar17);
  auVar127 = vmaxps_avx(auVar127,auVar97);
  auVar97 = vpminsd_avx2(auVar18,auVar19);
  uVar83 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar226._4_4_ = uVar83;
  auVar226._0_4_ = uVar83;
  auVar226._8_4_ = uVar83;
  auVar226._12_4_ = uVar83;
  auVar226._16_4_ = uVar83;
  auVar226._20_4_ = uVar83;
  auVar226._24_4_ = uVar83;
  auVar226._28_4_ = uVar83;
  auVar97 = vmaxps_avx(auVar97,auVar226);
  auVar127 = vmaxps_avx(auVar127,auVar97);
  local_320._4_4_ = auVar127._4_4_ * 0.99999964;
  local_320._0_4_ = auVar127._0_4_ * 0.99999964;
  local_320._8_4_ = auVar127._8_4_ * 0.99999964;
  local_320._12_4_ = auVar127._12_4_ * 0.99999964;
  local_320._16_4_ = auVar127._16_4_ * 0.99999964;
  local_320._20_4_ = auVar127._20_4_ * 0.99999964;
  local_320._24_4_ = auVar127._24_4_ * 0.99999964;
  local_320._28_4_ = auVar127._28_4_;
  auVar127 = vpmaxsd_avx2(auVar147,auVar15);
  auVar97 = vpmaxsd_avx2(auVar16,auVar17);
  auVar127 = vminps_avx(auVar127,auVar97);
  auVar97 = vpmaxsd_avx2(auVar18,auVar19);
  fVar109 = (ray->super_RayK<1>).tfar;
  auVar144._4_4_ = fVar109;
  auVar144._0_4_ = fVar109;
  auVar144._8_4_ = fVar109;
  auVar144._12_4_ = fVar109;
  auVar144._16_4_ = fVar109;
  auVar144._20_4_ = fVar109;
  auVar144._24_4_ = fVar109;
  auVar144._28_4_ = fVar109;
  auVar97 = vminps_avx(auVar97,auVar144);
  auVar127 = vminps_avx(auVar127,auVar97);
  auVar168._4_4_ = auVar127._4_4_ * 1.0000004;
  auVar168._0_4_ = auVar127._0_4_ * 1.0000004;
  auVar168._8_4_ = auVar127._8_4_ * 1.0000004;
  auVar168._12_4_ = auVar127._12_4_ * 1.0000004;
  auVar168._16_4_ = auVar127._16_4_ * 1.0000004;
  auVar168._20_4_ = auVar127._20_4_ * 1.0000004;
  auVar168._24_4_ = auVar127._24_4_ * 1.0000004;
  auVar168._28_4_ = auVar127._28_4_;
  auVar127._1_3_ = 0;
  auVar127[0] = PVar7;
  auVar127[4] = PVar7;
  auVar127._5_3_ = 0;
  auVar127[8] = PVar7;
  auVar127._9_3_ = 0;
  auVar127[0xc] = PVar7;
  auVar127._13_3_ = 0;
  auVar127[0x10] = PVar7;
  auVar127._17_3_ = 0;
  auVar127[0x14] = PVar7;
  auVar127._21_3_ = 0;
  auVar127[0x18] = PVar7;
  auVar127._25_3_ = 0;
  auVar127[0x1c] = PVar7;
  auVar127._29_3_ = 0;
  auVar97 = vpcmpgtd_avx2(auVar127,_DAT_01fe9900);
  auVar127 = vcmpps_avx(local_320,auVar168,2);
  auVar127 = vandps_avx(auVar127,auVar97);
  uVar73 = vmovmskps_avx(auVar127);
  if (uVar73 == 0) {
    return;
  }
  uVar73 = uVar73 & 0xff;
  auVar97._16_16_ = mm_lookupmask_ps._240_16_;
  auVar97._0_16_ = mm_lookupmask_ps._240_16_;
  local_380 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,0x80);
  local_540 = 0x80000000;
  uStack_53c = 0x80000000;
  uStack_538 = 0x80000000;
  uStack_534 = 0x80000000;
  fStack_530 = -0.0;
  fStack_52c = -0.0;
  fStack_528 = -0.0;
  uStack_524 = 0x80000000;
LAB_01867cff:
  lVar79 = 0;
  for (uVar74 = (ulong)uVar73; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
    lVar79 = lVar79 + 1;
  }
  uVar80 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar80].ptr;
  uVar74 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar79 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar109 = (pGVar8->time_range).lower;
  fVar109 = pGVar8->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar109) /
            ((pGVar8->time_range).upper - fVar109));
  auVar90 = vroundss_avx(ZEXT416((uint)fVar109),ZEXT416((uint)fVar109),9);
  auVar90 = vminss_avx(auVar90,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar90 = vmaxss_avx(ZEXT816(0) << 0x20,auVar90);
  fVar109 = fVar109 - auVar90._0_4_;
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar78 = (long)(int)auVar90._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + 0x10 + lVar78);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar78);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar78);
  pfVar1 = (float *)(lVar11 + uVar74 * lVar12);
  auVar110._0_4_ = fVar109 * *pfVar1;
  auVar110._4_4_ = fVar109 * pfVar1[1];
  auVar110._8_4_ = fVar109 * pfVar1[2];
  auVar110._12_4_ = fVar109 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + (uVar74 + 1) * lVar12);
  auVar137._0_4_ = fVar109 * *pfVar1;
  auVar137._4_4_ = fVar109 * pfVar1[1];
  auVar137._8_4_ = fVar109 * pfVar1[2];
  auVar137._12_4_ = fVar109 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + (uVar74 + 2) * lVar12);
  auVar180._0_4_ = fVar109 * *pfVar1;
  auVar180._4_4_ = fVar109 * pfVar1[1];
  auVar180._8_4_ = fVar109 * pfVar1[2];
  auVar180._12_4_ = fVar109 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + lVar12 * (uVar74 + 3));
  auVar153._0_4_ = fVar109 * *pfVar1;
  auVar153._4_4_ = fVar109 * pfVar1[1];
  auVar153._8_4_ = fVar109 * pfVar1[2];
  auVar153._12_4_ = fVar109 * pfVar1[3];
  lVar11 = *(long *)(_Var9 + lVar78);
  fVar109 = 1.0 - fVar109;
  auVar86._4_4_ = fVar109;
  auVar86._0_4_ = fVar109;
  auVar86._8_4_ = fVar109;
  auVar86._12_4_ = fVar109;
  auVar141 = vfmadd231ps_fma(auVar110,auVar86,*(undefined1 (*) [16])(lVar11 + lVar10 * uVar74));
  auVar202 = vfmadd231ps_fma(auVar137,auVar86,*(undefined1 (*) [16])(lVar11 + lVar10 * (uVar74 + 1))
                            );
  auVar94 = vfmadd231ps_fma(auVar180,auVar86,*(undefined1 (*) [16])(lVar11 + lVar10 * (uVar74 + 2)))
  ;
  auVar220 = vfmadd231ps_fma(auVar153,auVar86,*(undefined1 (*) [16])(lVar11 + lVar10 * (uVar74 + 3))
                            );
  auVar197._0_4_ = (auVar141._0_4_ + auVar202._0_4_ + auVar94._0_4_ + auVar220._0_4_) * 0.25;
  auVar197._4_4_ = (auVar141._4_4_ + auVar202._4_4_ + auVar94._4_4_ + auVar220._4_4_) * 0.25;
  auVar197._8_4_ = (auVar141._8_4_ + auVar202._8_4_ + auVar94._8_4_ + auVar220._8_4_) * 0.25;
  auVar197._12_4_ = (auVar141._12_4_ + auVar202._12_4_ + auVar94._12_4_ + auVar220._12_4_) * 0.25;
  aVar2 = (ray->super_RayK<1>).org.field_0;
  aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar90 = vsubps_avx(auVar197,(undefined1  [16])aVar2);
  auVar90 = vdpps_avx(auVar90,(undefined1  [16])aVar3,0x7f);
  auVar4 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar182 = vrcpss_avx(auVar4,auVar4);
  auVar4 = vfnmadd213ss_fma(auVar182,auVar4,ZEXT416(0x40000000));
  fVar109 = auVar182._0_4_ * auVar4._0_4_;
  auVar223 = ZEXT464((uint)fVar109);
  fVar109 = auVar90._0_4_ * fVar109;
  local_770 = ZEXT416((uint)fVar109);
  auVar198._4_4_ = fVar109;
  auVar198._0_4_ = fVar109;
  auVar198._8_4_ = fVar109;
  auVar198._12_4_ = fVar109;
  fStack_7d0 = fVar109;
  _local_7e0 = auVar198;
  fStack_7cc = fVar109;
  fStack_7c8 = fVar109;
  fStack_7c4 = fVar109;
  auVar90 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar198);
  auVar90 = vblendps_avx(auVar90,_DAT_01f7aa10,8);
  local_950 = vsubps_avx(auVar141,auVar90);
  local_960 = vsubps_avx(auVar94,auVar90);
  local_970 = vsubps_avx(auVar202,auVar90);
  _local_980 = vsubps_avx(auVar220,auVar90);
  auVar90 = vmovshdup_avx(local_950);
  local_1e0 = auVar90._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar90 = vshufps_avx(local_950,local_950,0xaa);
  uVar84 = auVar90._0_8_;
  local_9a0._8_8_ = uVar84;
  local_9a0._0_8_ = uVar84;
  local_9a0._16_8_ = uVar84;
  local_9a0._24_8_ = uVar84;
  auVar254 = ZEXT3264(local_9a0);
  auVar90 = vshufps_avx(local_950,local_950,0xff);
  uVar84 = auVar90._0_8_;
  local_9c0._8_8_ = uVar84;
  local_9c0._0_8_ = uVar84;
  local_9c0._16_8_ = uVar84;
  local_9c0._24_8_ = uVar84;
  auVar261 = ZEXT3264(local_9c0);
  auVar90 = vmovshdup_avx(local_970);
  local_200 = auVar90._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar90 = vshufps_avx(local_970,local_970,0xaa);
  local_220 = auVar90._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar90 = vshufps_avx(local_970,local_970,0xff);
  uVar84 = auVar90._0_8_;
  local_9e0._8_8_ = uVar84;
  local_9e0._0_8_ = uVar84;
  local_9e0._16_8_ = uVar84;
  local_9e0._24_8_ = uVar84;
  auVar267 = ZEXT3264(local_9e0);
  auVar90 = vmovshdup_avx(local_960);
  local_340 = auVar90._0_4_;
  fStack_33c = auVar90._4_4_;
  auVar90 = vshufps_avx(local_960,local_960,0xaa);
  local_240 = auVar90._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar90 = vshufps_avx(local_960,local_960,0xff);
  local_360 = auVar90._0_4_;
  fStack_35c = auVar90._4_4_;
  auVar90 = vmovshdup_avx(_local_980);
  local_260 = auVar90._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar90 = vshufps_avx(_local_980,_local_980,0xaa);
  local_280 = auVar90._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar90 = vshufps_avx(_local_980,_local_980,0xff);
  local_2a0 = auVar90._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar87._0_4_ = aVar3.x * aVar3.x;
  auVar87._4_4_ = aVar3.y * aVar3.y;
  auVar87._8_4_ = aVar3.z * aVar3.z;
  auVar87._12_4_ = aVar3.field_3.w * aVar3.field_3.w;
  auVar90 = vshufps_avx(auVar87,auVar87,0xaa);
  uVar84 = auVar90._0_8_;
  auVar244._8_8_ = uVar84;
  auVar244._0_8_ = uVar84;
  auVar244._16_8_ = uVar84;
  auVar244._24_8_ = uVar84;
  uVar83 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_680._4_4_ = uVar83;
  local_680._0_4_ = uVar83;
  fStack_678 = (float)uVar83;
  fStack_674 = (float)uVar83;
  fStack_670 = (float)uVar83;
  fStack_66c = (float)uVar83;
  fStack_668 = (float)uVar83;
  register0x0000125c = uVar83;
  uVar83 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_6a0._4_4_ = uVar83;
  local_6a0._0_4_ = uVar83;
  fStack_698 = (float)uVar83;
  fStack_694 = (float)uVar83;
  fStack_690 = (float)uVar83;
  fStack_68c = (float)uVar83;
  fStack_688 = (float)uVar83;
  register0x0000149c = uVar83;
  auVar237 = ZEXT3264(_local_6a0);
  auVar90 = vfmadd231ps_fma(auVar244,_local_6a0,_local_6a0);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),_local_680,_local_680);
  auVar248 = ZEXT1664(auVar90);
  local_aec = 1;
  uVar82 = 0;
  local_6c0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_6bc = local_6c0;
  fStack_6b8 = local_6c0;
  fStack_6b4 = local_6c0;
  fStack_6b0 = local_6c0;
  fStack_6ac = local_6c0;
  fStack_6a8 = local_6c0;
  fStack_6a4 = local_6c0;
  uVar83 = local_950._0_4_;
  local_940._4_4_ = uVar83;
  local_940._0_4_ = uVar83;
  local_940._8_4_ = uVar83;
  local_940._12_4_ = uVar83;
  local_940._16_4_ = uVar83;
  local_940._20_4_ = uVar83;
  local_940._24_4_ = uVar83;
  local_940._28_4_ = uVar83;
  auVar231 = ZEXT3264(local_940);
  uVar83 = local_970._0_4_;
  local_a00._4_4_ = uVar83;
  local_a00._0_4_ = uVar83;
  local_a00._8_4_ = uVar83;
  local_a00._12_4_ = uVar83;
  local_a00._16_4_ = uVar83;
  local_a00._20_4_ = uVar83;
  local_a00._24_4_ = uVar83;
  local_a00._28_4_ = uVar83;
  auVar234 = ZEXT3264(local_a00);
  uVar83 = local_960._0_4_;
  local_300._4_4_ = uVar83;
  local_300._0_4_ = uVar83;
  local_300._8_4_ = uVar83;
  local_300._12_4_ = uVar83;
  local_300._16_4_ = uVar83;
  local_300._20_4_ = uVar83;
  local_300._24_4_ = uVar83;
  local_300._28_4_ = uVar83;
  local_2e0 = local_980._0_4_;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_3a0 = vandps_avx(ZEXT1632(auVar90),local_720);
  local_430 = ZEXT816(0x3f80000000000000);
  local_2c0 = ZEXT1632(auVar90);
  uVar74 = (ulong)*(uint *)(prim + lVar79 * 4 + 6);
  fStack_358 = local_360;
  fStack_354 = fStack_35c;
  fStack_350 = local_360;
  fStack_34c = fStack_35c;
  fStack_348 = local_360;
  fStack_344 = fStack_35c;
  fStack_338 = local_340;
  fStack_334 = fStack_33c;
  fStack_330 = local_340;
  fStack_32c = fStack_33c;
  fStack_328 = local_340;
  fStack_324 = fStack_33c;
  do {
    auVar167._8_4_ = 0x3f800000;
    auVar167._0_8_ = 0x3f8000003f800000;
    auVar167._12_4_ = 0x3f800000;
    auVar167._16_4_ = 0x3f800000;
    auVar167._20_4_ = 0x3f800000;
    auVar167._24_4_ = 0x3f800000;
    auVar167._28_4_ = 0x3f800000;
    iVar81 = (int)uVar82;
    auVar90 = vmovshdup_avx(local_430);
    auVar90 = vsubps_avx(auVar90,local_430);
    fVar133 = auVar90._0_4_;
    fVar135 = fVar133 * 0.04761905;
    local_700._0_4_ = local_430._0_4_;
    local_700._4_4_ = local_700._0_4_;
    local_700._8_4_ = local_700._0_4_;
    local_700._12_4_ = local_700._0_4_;
    local_700._16_4_ = local_700._0_4_;
    local_700._20_4_ = local_700._0_4_;
    local_700._24_4_ = local_700._0_4_;
    local_700._28_4_ = local_700._0_4_;
    local_620._4_4_ = fVar133;
    local_620._0_4_ = fVar133;
    local_620._8_4_ = fVar133;
    local_620._12_4_ = fVar133;
    local_620._16_4_ = fVar133;
    local_620._20_4_ = fVar133;
    local_620._24_4_ = fVar133;
    local_620._28_4_ = fVar133;
    auVar90 = vfmadd231ps_fma(local_700,local_620,_DAT_01faff20);
    auVar127 = vsubps_avx(auVar167,ZEXT1632(auVar90));
    fVar109 = auVar90._0_4_;
    auVar249._0_4_ = auVar234._0_4_ * fVar109;
    fVar130 = auVar90._4_4_;
    auVar249._4_4_ = auVar234._4_4_ * fVar130;
    fVar131 = auVar90._8_4_;
    auVar249._8_4_ = auVar234._8_4_ * fVar131;
    fVar132 = auVar90._12_4_;
    auVar249._12_4_ = auVar234._12_4_ * fVar132;
    auVar249._16_4_ = auVar234._16_4_ * 0.0;
    auVar249._20_4_ = auVar234._20_4_ * 0.0;
    auVar249._28_36_ = auVar248._28_36_;
    auVar249._24_4_ = auVar234._24_4_ * 0.0;
    auVar69._8_8_ = uStack_1f8;
    auVar69._0_8_ = local_200;
    auVar69._16_8_ = uStack_1f0;
    auVar69._24_8_ = uStack_1e8;
    auVar128._0_4_ = (float)local_200 * fVar109;
    auVar128._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar130;
    auVar128._8_4_ = (float)uStack_1f8 * fVar131;
    auVar128._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar132;
    auVar128._16_4_ = (float)uStack_1f0 * 0.0;
    auVar128._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar128._28_36_ = auVar237._28_36_;
    auVar128._24_4_ = (float)uStack_1e8 * 0.0;
    auVar68._8_8_ = uStack_218;
    auVar68._0_8_ = local_220;
    auVar68._16_8_ = uStack_210;
    auVar68._24_8_ = uStack_208;
    auVar237._0_4_ = (float)local_220 * fVar109;
    auVar237._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar130;
    auVar237._8_4_ = (float)uStack_218 * fVar131;
    auVar237._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar132;
    auVar237._16_4_ = (float)uStack_210 * 0.0;
    auVar237._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar237._28_36_ = auVar223._28_36_;
    auVar237._24_4_ = (float)uStack_208 * 0.0;
    auVar21._4_4_ = auVar267._4_4_ * fVar130;
    auVar21._0_4_ = auVar267._0_4_ * fVar109;
    auVar21._8_4_ = auVar267._8_4_ * fVar131;
    auVar21._12_4_ = auVar267._12_4_ * fVar132;
    auVar21._16_4_ = auVar267._16_4_ * 0.0;
    auVar21._20_4_ = auVar267._20_4_ * 0.0;
    auVar21._24_4_ = auVar267._24_4_ * 0.0;
    auVar21._28_4_ = fVar133;
    auVar90 = vfmadd231ps_fma(auVar249._0_32_,auVar127,auVar231._0_32_);
    auVar70._8_8_ = uStack_1d8;
    auVar70._0_8_ = local_1e0;
    auVar70._16_8_ = uStack_1d0;
    auVar70._24_8_ = uStack_1c8;
    auVar4 = vfmadd231ps_fma(auVar128._0_32_,auVar127,auVar70);
    auVar182 = vfmadd231ps_fma(auVar237._0_32_,auVar127,auVar254._0_32_);
    auVar141 = vfmadd231ps_fma(auVar21,auVar127,auVar261._0_32_);
    auVar248._0_4_ = local_300._0_4_ * fVar109;
    auVar248._4_4_ = local_300._4_4_ * fVar130;
    auVar248._8_4_ = local_300._8_4_ * fVar131;
    auVar248._12_4_ = local_300._12_4_ * fVar132;
    auVar248._16_4_ = local_300._16_4_ * 0.0;
    auVar248._20_4_ = local_300._20_4_ * 0.0;
    auVar248._28_36_ = auVar231._28_36_;
    auVar248._24_4_ = local_300._24_4_ * 0.0;
    auVar22._4_4_ = fVar130 * fStack_33c;
    auVar22._0_4_ = fVar109 * local_340;
    auVar22._8_4_ = fVar131 * fStack_338;
    auVar22._12_4_ = fVar132 * fStack_334;
    auVar22._16_4_ = fStack_330 * 0.0;
    auVar22._20_4_ = fStack_32c * 0.0;
    auVar22._24_4_ = fStack_328 * 0.0;
    auVar22._28_4_ = local_300._28_4_;
    auVar67._8_8_ = uStack_238;
    auVar67._0_8_ = local_240;
    auVar67._16_8_ = uStack_230;
    auVar67._24_8_ = uStack_228;
    auVar72._4_4_ = (float)((ulong)local_240 >> 0x20) * fVar130;
    auVar72._0_4_ = (float)local_240 * fVar109;
    auVar72._8_4_ = (float)uStack_238 * fVar131;
    auVar72._12_4_ = (float)((ulong)uStack_238 >> 0x20) * fVar132;
    auVar72._16_4_ = (float)uStack_230 * 0.0;
    auVar72._20_4_ = (float)((ulong)uStack_230 >> 0x20) * 0.0;
    auVar72._24_4_ = (float)uStack_228 * 0.0;
    auVar72._28_4_ = DAT_01faff20._28_4_;
    auVar23._4_4_ = fVar130 * fStack_35c;
    auVar23._0_4_ = fVar109 * local_360;
    auVar23._8_4_ = fVar131 * fStack_358;
    auVar23._12_4_ = fVar132 * fStack_354;
    auVar23._16_4_ = fStack_350 * 0.0;
    auVar23._20_4_ = fStack_34c * 0.0;
    uVar83 = (undefined4)((ulong)uStack_208 >> 0x20);
    auVar23._24_4_ = fStack_348 * 0.0;
    auVar23._28_4_ = uVar83;
    auVar202 = vfmadd231ps_fma(auVar248._0_32_,auVar127,auVar234._0_32_);
    auVar94 = vfmadd231ps_fma(auVar22,auVar127,auVar69);
    auVar220 = vfmadd231ps_fma(auVar72,auVar127,auVar68);
    auVar5 = vfmadd231ps_fma(auVar23,auVar127,auVar267._0_32_);
    auVar24._4_4_ = fVar130 * fStack_2dc;
    auVar24._0_4_ = fVar109 * local_2e0;
    auVar24._8_4_ = fVar131 * fStack_2d8;
    auVar24._12_4_ = fVar132 * fStack_2d4;
    auVar24._16_4_ = fStack_2d0 * 0.0;
    auVar24._20_4_ = fStack_2cc * 0.0;
    auVar24._24_4_ = fStack_2c8 * 0.0;
    auVar24._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar25._4_4_ = fVar130 * local_260._4_4_;
    auVar25._0_4_ = fVar109 * (float)local_260;
    auVar25._8_4_ = fVar131 * (float)uStack_258;
    auVar25._12_4_ = fVar132 * uStack_258._4_4_;
    auVar25._16_4_ = (float)uStack_250 * 0.0;
    auVar25._20_4_ = uStack_250._4_4_ * 0.0;
    auVar25._24_4_ = (float)uStack_248 * 0.0;
    auVar25._28_4_ = uVar83;
    auVar26._28_4_ = auVar267._28_4_;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(auVar202._12_4_ * fVar132,
                            CONCAT48(auVar202._8_4_ * fVar131,
                                     CONCAT44(auVar202._4_4_ * fVar130,auVar202._0_4_ * fVar109))));
    auVar90 = vfmadd231ps_fma(auVar26,auVar127,ZEXT1632(auVar90));
    auVar4 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar132 * auVar94._12_4_,
                                                CONCAT48(fVar131 * auVar94._8_4_,
                                                         CONCAT44(fVar130 * auVar94._4_4_,
                                                                  fVar109 * auVar94._0_4_)))),
                             auVar127,ZEXT1632(auVar4));
    auVar182 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar132 * auVar220._12_4_,
                                                  CONCAT48(fVar131 * auVar220._8_4_,
                                                           CONCAT44(fVar130 * auVar220._4_4_,
                                                                    fVar109 * auVar220._0_4_)))),
                               auVar127,ZEXT1632(auVar182));
    auVar234._0_28_ =
         ZEXT1628(CONCAT412(fVar132 * auVar5._12_4_,
                            CONCAT48(fVar131 * auVar5._8_4_,
                                     CONCAT44(fVar130 * auVar5._4_4_,fVar109 * auVar5._0_4_))));
    auVar141 = vfmadd231ps_fma(auVar234._0_32_,auVar127,ZEXT1632(auVar141));
    auVar221._0_4_ = fVar109 * (float)local_280;
    auVar221._4_4_ = fVar130 * local_280._4_4_;
    auVar221._8_4_ = fVar131 * (float)uStack_278;
    auVar221._12_4_ = fVar132 * uStack_278._4_4_;
    auVar221._16_4_ = (float)uStack_270 * 0.0;
    auVar221._20_4_ = uStack_270._4_4_ * 0.0;
    auVar221._24_4_ = (float)uStack_268 * 0.0;
    auVar221._28_4_ = 0;
    auVar6 = vfmadd231ps_fma(auVar24,auVar127,local_300);
    auVar202 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * fVar132,
                                                  CONCAT48(auVar6._8_4_ * fVar131,
                                                           CONCAT44(auVar6._4_4_ * fVar130,
                                                                    auVar6._0_4_ * fVar109)))),
                               auVar127,ZEXT1632(auVar202));
    auVar227._0_4_ = fVar109 * (float)local_2a0;
    auVar227._4_4_ = fVar130 * local_2a0._4_4_;
    auVar227._8_4_ = fVar131 * (float)uStack_298;
    auVar227._12_4_ = fVar132 * uStack_298._4_4_;
    auVar227._16_4_ = (float)uStack_290 * 0.0;
    auVar227._20_4_ = uStack_290._4_4_ * 0.0;
    auVar227._24_4_ = (float)uStack_288 * 0.0;
    auVar227._28_4_ = 0;
    auVar66._4_4_ = fStack_33c;
    auVar66._0_4_ = local_340;
    auVar66._8_4_ = fStack_338;
    auVar66._12_4_ = fStack_334;
    auVar66._16_4_ = fStack_330;
    auVar66._20_4_ = fStack_32c;
    auVar66._24_4_ = fStack_328;
    auVar66._28_4_ = fStack_324;
    auVar6 = vfmadd231ps_fma(auVar25,auVar127,auVar66);
    auVar85 = vfmadd231ps_fma(auVar221,auVar127,auVar67);
    auVar65._4_4_ = fStack_35c;
    auVar65._0_4_ = local_360;
    auVar65._8_4_ = fStack_358;
    auVar65._12_4_ = fStack_354;
    auVar65._16_4_ = fStack_350;
    auVar65._20_4_ = fStack_34c;
    auVar65._24_4_ = fStack_348;
    auVar65._28_4_ = fStack_344;
    auVar136 = vfmadd231ps_fma(auVar227,auVar127,auVar65);
    auVar27._28_4_ = local_300._28_4_;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar136._12_4_ * fVar132,
                            CONCAT48(auVar136._8_4_ * fVar131,
                                     CONCAT44(auVar136._4_4_ * fVar130,auVar136._0_4_ * fVar109))));
    auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar6._12_4_ * fVar132,
                                                 CONCAT48(auVar6._8_4_ * fVar131,
                                                          CONCAT44(auVar6._4_4_ * fVar130,
                                                                   auVar6._0_4_ * fVar109)))),
                              auVar127,ZEXT1632(auVar94));
    auVar220 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar132 * auVar85._12_4_,
                                                  CONCAT48(fVar131 * auVar85._8_4_,
                                                           CONCAT44(fVar130 * auVar85._4_4_,
                                                                    fVar109 * auVar85._0_4_)))),
                               auVar127,ZEXT1632(auVar220));
    auVar5 = vfmadd231ps_fma(auVar27,auVar127,ZEXT1632(auVar5));
    auVar28._28_4_ = (int)((ulong)uStack_228 >> 0x20);
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(fVar132 * auVar220._12_4_,
                            CONCAT48(fVar131 * auVar220._8_4_,
                                     CONCAT44(fVar130 * auVar220._4_4_,fVar109 * auVar220._0_4_))));
    auVar6 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar202._12_4_ * fVar132,
                                                CONCAT48(auVar202._8_4_ * fVar131,
                                                         CONCAT44(auVar202._4_4_ * fVar130,
                                                                  auVar202._0_4_ * fVar109)))),
                             auVar127,ZEXT1632(auVar90));
    auVar85 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar94._12_4_ * fVar132,
                                                 CONCAT48(auVar94._8_4_ * fVar131,
                                                          CONCAT44(auVar94._4_4_ * fVar130,
                                                                   auVar94._0_4_ * fVar109)))),
                              auVar127,ZEXT1632(auVar4));
    auVar98 = ZEXT1632(auVar85);
    auVar85 = vfmadd231ps_fma(auVar28,auVar127,ZEXT1632(auVar182));
    auVar136 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar5._12_4_ * fVar132,
                                                  CONCAT48(auVar5._8_4_ * fVar131,
                                                           CONCAT44(auVar5._4_4_ * fVar130,
                                                                    auVar5._0_4_ * fVar109)))),
                               ZEXT1632(auVar141),auVar127);
    auVar97 = vsubps_avx(ZEXT1632(auVar202),ZEXT1632(auVar90));
    auVar127 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar4));
    auVar14 = vsubps_avx(ZEXT1632(auVar220),ZEXT1632(auVar182));
    auVar147 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar141));
    fVar196 = fVar135 * auVar97._0_4_ * 3.0;
    fVar208 = fVar135 * auVar97._4_4_ * 3.0;
    local_7c0._4_4_ = fVar208;
    local_7c0._0_4_ = fVar196;
    fVar209 = fVar135 * auVar97._8_4_ * 3.0;
    local_7c0._8_4_ = fVar209;
    fVar210 = fVar135 * auVar97._12_4_ * 3.0;
    local_7c0._12_4_ = fVar210;
    fVar211 = fVar135 * auVar97._16_4_ * 3.0;
    local_7c0._16_4_ = fVar211;
    fVar212 = fVar135 * auVar97._20_4_ * 3.0;
    local_7c0._20_4_ = fVar212;
    fVar213 = fVar135 * auVar97._24_4_ * 3.0;
    local_7c0._24_4_ = fVar213;
    local_7c0._28_4_ = 0x40400000;
    local_920._0_4_ = fVar135 * auVar127._0_4_ * 3.0;
    local_920._4_4_ = fVar135 * auVar127._4_4_ * 3.0;
    local_920._8_4_ = fVar135 * auVar127._8_4_ * 3.0;
    local_920._12_4_ = fVar135 * auVar127._12_4_ * 3.0;
    local_920._16_4_ = fVar135 * auVar127._16_4_ * 3.0;
    local_920._20_4_ = fVar135 * auVar127._20_4_ * 3.0;
    local_920._24_4_ = fVar135 * auVar127._24_4_ * 3.0;
    local_920._28_4_ = 0;
    local_600._0_4_ = fVar135 * auVar14._0_4_ * 3.0;
    local_600._4_4_ = fVar135 * auVar14._4_4_ * 3.0;
    local_600._8_4_ = fVar135 * auVar14._8_4_ * 3.0;
    local_600._12_4_ = fVar135 * auVar14._12_4_ * 3.0;
    local_600._16_4_ = fVar135 * auVar14._16_4_ * 3.0;
    local_600._20_4_ = fVar135 * auVar14._20_4_ * 3.0;
    local_600._24_4_ = fVar135 * auVar14._24_4_ * 3.0;
    local_600._28_4_ = 0;
    fVar109 = fVar135 * auVar147._0_4_ * 3.0;
    fVar130 = fVar135 * auVar147._4_4_ * 3.0;
    auVar29._4_4_ = fVar130;
    auVar29._0_4_ = fVar109;
    fVar131 = fVar135 * auVar147._8_4_ * 3.0;
    auVar29._8_4_ = fVar131;
    fVar132 = fVar135 * auVar147._12_4_ * 3.0;
    auVar29._12_4_ = fVar132;
    fVar133 = fVar135 * auVar147._16_4_ * 3.0;
    auVar29._16_4_ = fVar133;
    fVar134 = fVar135 * auVar147._20_4_ * 3.0;
    auVar29._20_4_ = fVar134;
    fVar135 = fVar135 * auVar147._24_4_ * 3.0;
    auVar29._24_4_ = fVar135;
    auVar29._28_4_ = auVar97._28_4_;
    auVar168 = ZEXT1632(auVar6);
    auVar15 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar6));
    local_8a0 = vpermps_avx2(_DAT_01fec480,auVar98);
    _local_7a0 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar85));
    _local_5c0 = vsubps_avx(auVar15,auVar168);
    local_4a0 = vsubps_avx(_local_7a0,ZEXT1632(auVar85));
    fVar175 = local_4a0._0_4_;
    fVar176 = local_4a0._4_4_;
    auVar30._4_4_ = fVar176 * fVar208;
    auVar30._0_4_ = fVar175 * fVar196;
    fVar196 = local_4a0._8_4_;
    auVar30._8_4_ = fVar196 * fVar209;
    fVar208 = local_4a0._12_4_;
    auVar30._12_4_ = fVar208 * fVar210;
    fVar209 = local_4a0._16_4_;
    auVar30._16_4_ = fVar209 * fVar211;
    fVar210 = local_4a0._20_4_;
    auVar30._20_4_ = fVar210 * fVar212;
    fVar211 = local_4a0._24_4_;
    auVar30._24_4_ = fVar211 * fVar213;
    auVar30._28_4_ = auVar15._28_4_;
    auVar90 = vfmsub231ps_fma(auVar30,local_600,_local_5c0);
    local_4c0 = vsubps_avx(local_8a0,auVar98);
    fVar235 = local_5c0._0_4_;
    fVar238 = local_5c0._4_4_;
    auVar31._4_4_ = fVar238 * local_920._4_4_;
    auVar31._0_4_ = fVar235 * local_920._0_4_;
    fVar239 = local_5c0._8_4_;
    auVar31._8_4_ = fVar239 * local_920._8_4_;
    fVar240 = local_5c0._12_4_;
    auVar31._12_4_ = fVar240 * local_920._12_4_;
    fVar241 = local_5c0._16_4_;
    auVar31._16_4_ = fVar241 * local_920._16_4_;
    fVar242 = local_5c0._20_4_;
    auVar31._20_4_ = fVar242 * local_920._20_4_;
    fVar243 = local_5c0._24_4_;
    auVar31._24_4_ = fVar243 * local_920._24_4_;
    auVar31._28_4_ = local_8a0._28_4_;
    auVar4 = vfmsub231ps_fma(auVar31,local_7c0,local_4c0);
    auVar32._28_4_ = local_7a0._28_4_;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(auVar4._12_4_ * auVar4._12_4_,
                            CONCAT48(auVar4._8_4_ * auVar4._8_4_,
                                     CONCAT44(auVar4._4_4_ * auVar4._4_4_,
                                              auVar4._0_4_ * auVar4._0_4_))));
    auVar90 = vfmadd231ps_fma(auVar32,ZEXT1632(auVar90),ZEXT1632(auVar90));
    fVar212 = local_4c0._0_4_;
    auVar99._0_4_ = fVar212 * local_600._0_4_;
    fVar213 = local_4c0._4_4_;
    auVar99._4_4_ = fVar213 * local_600._4_4_;
    fVar177 = local_4c0._8_4_;
    auVar99._8_4_ = fVar177 * local_600._8_4_;
    fVar178 = local_4c0._12_4_;
    auVar99._12_4_ = fVar178 * local_600._12_4_;
    fVar179 = local_4c0._16_4_;
    auVar99._16_4_ = fVar179 * local_600._16_4_;
    fVar250 = local_4c0._20_4_;
    auVar99._20_4_ = fVar250 * local_600._20_4_;
    fVar251 = local_4c0._24_4_;
    auVar99._24_4_ = fVar251 * local_600._24_4_;
    auVar99._28_4_ = 0;
    auVar182 = vfmsub231ps_fma(auVar99,local_920,local_4a0);
    auVar145._0_4_ = fVar175 * fVar175;
    auVar145._4_4_ = fVar176 * fVar176;
    auVar145._8_4_ = fVar196 * fVar196;
    auVar145._12_4_ = fVar208 * fVar208;
    auVar145._16_4_ = fVar209 * fVar209;
    auVar145._20_4_ = fVar210 * fVar210;
    auVar145._24_4_ = fVar211 * fVar211;
    auVar145._28_4_ = 0;
    auVar4 = vfmadd231ps_fma(auVar145,local_4c0,local_4c0);
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_5c0,_local_5c0);
    auVar127 = vrcpps_avx(ZEXT1632(auVar4));
    auVar182 = vfmadd231ps_fma(ZEXT1632(auVar90),ZEXT1632(auVar182),ZEXT1632(auVar182));
    auVar256._8_4_ = 0x3f800000;
    auVar256._0_8_ = 0x3f8000003f800000;
    auVar256._12_4_ = 0x3f800000;
    auVar256._16_4_ = 0x3f800000;
    auVar256._20_4_ = 0x3f800000;
    auVar256._24_4_ = 0x3f800000;
    auVar256._28_4_ = 0x3f800000;
    auVar90 = vfnmadd213ps_fma(auVar127,ZEXT1632(auVar4),auVar256);
    auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar127,auVar127);
    local_a20 = vpermps_avx2(_DAT_01fec480,local_7c0);
    local_a40 = vpermps_avx2(_DAT_01fec480,local_600);
    auVar33._4_4_ = local_a20._4_4_ * fVar176;
    auVar33._0_4_ = local_a20._0_4_ * fVar175;
    auVar33._8_4_ = local_a20._8_4_ * fVar196;
    auVar33._12_4_ = local_a20._12_4_ * fVar208;
    auVar33._16_4_ = local_a20._16_4_ * fVar209;
    auVar33._20_4_ = local_a20._20_4_ * fVar210;
    auVar33._24_4_ = local_a20._24_4_ * fVar211;
    auVar33._28_4_ = auVar127._28_4_;
    auVar141 = vfmsub231ps_fma(auVar33,local_a40,_local_5c0);
    local_840 = vpermps_avx2(_DAT_01fec480,local_920);
    auVar34._4_4_ = fVar238 * local_840._4_4_;
    auVar34._0_4_ = fVar235 * local_840._0_4_;
    auVar34._8_4_ = fVar239 * local_840._8_4_;
    auVar34._12_4_ = fVar240 * local_840._12_4_;
    auVar34._16_4_ = fVar241 * local_840._16_4_;
    auVar34._20_4_ = fVar242 * local_840._20_4_;
    auVar34._24_4_ = fVar243 * local_840._24_4_;
    auVar34._28_4_ = 0x40400000;
    auVar17 = local_a20;
    auVar202 = vfmsub231ps_fma(auVar34,local_a20,local_4c0);
    auVar141 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar202._12_4_ * auVar202._12_4_,
                                                  CONCAT48(auVar202._8_4_ * auVar202._8_4_,
                                                           CONCAT44(auVar202._4_4_ * auVar202._4_4_,
                                                                    auVar202._0_4_ * auVar202._0_4_)
                                                          ))),ZEXT1632(auVar141),ZEXT1632(auVar141))
    ;
    auVar16 = local_a40;
    auVar188._0_4_ = fVar212 * local_a40._0_4_;
    auVar188._4_4_ = fVar213 * local_a40._4_4_;
    auVar188._8_4_ = fVar177 * local_a40._8_4_;
    auVar188._12_4_ = fVar178 * local_a40._12_4_;
    auVar188._16_4_ = fVar179 * local_a40._16_4_;
    auVar188._20_4_ = fVar250 * local_a40._20_4_;
    auVar188._24_4_ = fVar251 * local_a40._24_4_;
    auVar188._28_4_ = 0;
    auVar18 = local_840;
    auVar202 = vfmsub231ps_fma(auVar188,local_840,local_4a0);
    auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),ZEXT1632(auVar202),ZEXT1632(auVar202));
    auVar127 = vmaxps_avx(ZEXT1632(CONCAT412(auVar182._12_4_ * auVar90._12_4_,
                                             CONCAT48(auVar182._8_4_ * auVar90._8_4_,
                                                      CONCAT44(auVar182._4_4_ * auVar90._4_4_,
                                                               auVar182._0_4_ * auVar90._0_4_)))),
                          ZEXT1632(CONCAT412(auVar141._12_4_ * auVar90._12_4_,
                                             CONCAT48(auVar141._8_4_ * auVar90._8_4_,
                                                      CONCAT44(auVar141._4_4_ * auVar90._4_4_,
                                                               auVar141._0_4_ * auVar90._0_4_)))));
    local_640._0_4_ = auVar136._0_4_ + fVar109;
    local_640._4_4_ = auVar136._4_4_ + fVar130;
    local_640._8_4_ = auVar136._8_4_ + fVar131;
    local_640._12_4_ = auVar136._12_4_ + fVar132;
    local_640._16_4_ = fVar133 + 0.0;
    local_640._20_4_ = fVar134 + 0.0;
    local_640._24_4_ = fVar135 + 0.0;
    local_640._28_4_ = auVar97._28_4_ + 0.0;
    _local_800 = ZEXT1632(auVar136);
    auVar97 = vsubps_avx(_local_800,auVar29);
    local_660 = vpermps_avx2(_DAT_01fec480,auVar97);
    local_820 = vpermps_avx2(_DAT_01fec480,_local_800);
    auVar97 = vmaxps_avx(_local_800,local_640);
    auVar19 = local_660;
    auVar14 = vmaxps_avx(local_660,local_820);
    auVar147 = vrsqrtps_avx(ZEXT1632(auVar4));
    auVar97 = vmaxps_avx(auVar97,auVar14);
    fVar109 = auVar147._0_4_;
    fVar130 = auVar147._4_4_;
    fVar131 = auVar147._8_4_;
    fVar132 = auVar147._12_4_;
    fVar135 = auVar147._16_4_;
    fVar133 = auVar147._20_4_;
    fVar134 = auVar147._24_4_;
    auVar35._4_4_ = fVar130 * fVar130 * fVar130 * auVar4._4_4_ * -0.5;
    auVar35._0_4_ = fVar109 * fVar109 * fVar109 * auVar4._0_4_ * -0.5;
    auVar35._8_4_ = fVar131 * fVar131 * fVar131 * auVar4._8_4_ * -0.5;
    auVar35._12_4_ = fVar132 * fVar132 * fVar132 * auVar4._12_4_ * -0.5;
    auVar35._16_4_ = fVar135 * fVar135 * fVar135 * -0.0;
    auVar35._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
    auVar35._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
    auVar35._28_4_ = 0;
    auVar100._8_4_ = 0x3fc00000;
    auVar100._0_8_ = 0x3fc000003fc00000;
    auVar100._12_4_ = 0x3fc00000;
    auVar100._16_4_ = 0x3fc00000;
    auVar100._20_4_ = 0x3fc00000;
    auVar100._24_4_ = 0x3fc00000;
    auVar100._28_4_ = 0x3fc00000;
    auVar90 = vfmadd231ps_fma(auVar35,auVar100,auVar147);
    fVar109 = auVar90._0_4_;
    fVar131 = auVar90._4_4_;
    auVar36._4_4_ = fVar213 * fVar131;
    auVar36._0_4_ = fVar212 * fVar109;
    fVar135 = auVar90._8_4_;
    auVar36._8_4_ = fVar177 * fVar135;
    fVar134 = auVar90._12_4_;
    auVar36._12_4_ = fVar178 * fVar134;
    auVar36._16_4_ = fVar179 * 0.0;
    auVar36._20_4_ = fVar250 * 0.0;
    auVar36._24_4_ = fVar251 * 0.0;
    auVar36._28_4_ = 0x3fc00000;
    auVar260._0_4_ = local_6c0 * fVar175 * fVar109;
    auVar260._4_4_ = fStack_6bc * fVar176 * fVar131;
    auVar260._8_4_ = fStack_6b8 * fVar196 * fVar135;
    auVar260._12_4_ = fStack_6b4 * fVar208 * fVar134;
    auVar260._16_4_ = fStack_6b0 * fVar209 * 0.0;
    auVar260._20_4_ = fStack_6ac * fVar210 * 0.0;
    auVar260._24_4_ = fStack_6a8 * fVar211 * 0.0;
    auVar260._28_4_ = 0;
    auVar90 = vfmadd231ps_fma(auVar260,auVar36,_local_6a0);
    local_480 = ZEXT1632(auVar85);
    local_860 = vsubps_avx(ZEXT832(0) << 0x20,local_480);
    fVar212 = local_860._0_4_;
    fVar213 = local_860._4_4_;
    auVar37._4_4_ = fVar213 * fVar176 * fVar131;
    auVar37._0_4_ = fVar212 * fVar175 * fVar109;
    fVar175 = local_860._8_4_;
    auVar37._8_4_ = fVar175 * fVar196 * fVar135;
    fVar176 = local_860._12_4_;
    auVar37._12_4_ = fVar176 * fVar208 * fVar134;
    fVar177 = local_860._16_4_;
    auVar37._16_4_ = fVar177 * fVar209 * 0.0;
    fVar178 = local_860._20_4_;
    auVar37._20_4_ = fVar178 * fVar210 * 0.0;
    fVar179 = local_860._24_4_;
    auVar37._24_4_ = fVar179 * fVar211 * 0.0;
    auVar37._28_4_ = local_4a0._28_4_;
    auVar14 = vsubps_avx(ZEXT832(0) << 0x20,auVar98);
    auVar4 = vfmadd231ps_fma(auVar37,auVar14,auVar36);
    auVar38._4_4_ = fVar238 * fVar131;
    auVar38._0_4_ = fVar235 * fVar109;
    auVar38._8_4_ = fVar239 * fVar135;
    auVar38._12_4_ = fVar240 * fVar134;
    auVar38._16_4_ = fVar241 * 0.0;
    auVar38._20_4_ = fVar242 * 0.0;
    auVar38._24_4_ = fVar243 * 0.0;
    auVar38._28_4_ = 0x3fc00000;
    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar38,_local_680);
    auVar246 = vsubps_avx(ZEXT832(0) << 0x20,auVar168);
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar246,auVar38);
    auVar223 = ZEXT1664(auVar4);
    auVar39._4_4_ = fStack_6bc * fVar213;
    auVar39._0_4_ = local_6c0 * fVar212;
    auVar39._8_4_ = fStack_6b8 * fVar175;
    auVar39._12_4_ = fStack_6b4 * fVar176;
    auVar39._16_4_ = fStack_6b0 * fVar177;
    auVar39._20_4_ = fStack_6ac * fVar178;
    auVar39._24_4_ = fStack_6a8 * fVar179;
    auVar39._28_4_ = 0x3fc00000;
    auVar182 = vfmadd231ps_fma(auVar39,_local_6a0,auVar14);
    auVar182 = vfmadd231ps_fma(ZEXT1632(auVar182),_local_680,auVar246);
    fVar130 = auVar4._0_4_;
    fVar235 = auVar90._0_4_;
    fVar132 = auVar4._4_4_;
    fVar238 = auVar90._4_4_;
    fVar133 = auVar4._8_4_;
    fVar239 = auVar90._8_4_;
    fVar196 = auVar4._12_4_;
    fVar240 = auVar90._12_4_;
    auVar147 = vsubps_avx(ZEXT1632(auVar182),
                          ZEXT1632(CONCAT412(fVar240 * fVar196,
                                             CONCAT48(fVar239 * fVar133,
                                                      CONCAT44(fVar238 * fVar132,fVar235 * fVar130))
                                            )));
    auVar40._4_4_ = fVar213 * fVar213;
    auVar40._0_4_ = fVar212 * fVar212;
    auVar40._8_4_ = fVar175 * fVar175;
    auVar40._12_4_ = fVar176 * fVar176;
    auVar40._16_4_ = fVar177 * fVar177;
    auVar40._20_4_ = fVar178 * fVar178;
    auVar40._24_4_ = fVar179 * fVar179;
    auVar40._28_4_ = 0;
    auVar182 = vfmadd231ps_fma(auVar40,auVar14,auVar14);
    auVar182 = vfmadd231ps_fma(ZEXT1632(auVar182),auVar246,auVar246);
    auVar71._28_4_ = DAT_01fec480._28_4_;
    auVar71._0_28_ =
         ZEXT1628(CONCAT412(fVar196 * fVar196,
                            CONCAT48(fVar133 * fVar133,CONCAT44(fVar132 * fVar132,fVar130 * fVar130)
                                    )));
    _local_6e0 = vsubps_avx(ZEXT1632(auVar182),auVar71);
    local_760 = vsqrtps_avx(auVar127);
    fVar211 = local_760._28_4_ + auVar97._28_4_;
    fVar130 = (local_760._0_4_ + auVar97._0_4_) * 1.0000002;
    fVar132 = (local_760._4_4_ + auVar97._4_4_) * 1.0000002;
    fVar133 = (local_760._8_4_ + auVar97._8_4_) * 1.0000002;
    fVar196 = (local_760._12_4_ + auVar97._12_4_) * 1.0000002;
    fVar208 = (local_760._16_4_ + auVar97._16_4_) * 1.0000002;
    fVar209 = (local_760._20_4_ + auVar97._20_4_) * 1.0000002;
    fVar210 = (local_760._24_4_ + auVar97._24_4_) * 1.0000002;
    auVar41._4_4_ = fVar132 * fVar132;
    auVar41._0_4_ = fVar130 * fVar130;
    auVar41._8_4_ = fVar133 * fVar133;
    auVar41._12_4_ = fVar196 * fVar196;
    auVar41._16_4_ = fVar208 * fVar208;
    auVar41._20_4_ = fVar209 * fVar209;
    auVar41._24_4_ = fVar210 * fVar210;
    auVar41._28_4_ = fVar211;
    local_4e0._0_4_ = auVar147._0_4_ + auVar147._0_4_;
    local_4e0._4_4_ = auVar147._4_4_ + auVar147._4_4_;
    local_4e0._8_4_ = auVar147._8_4_ + auVar147._8_4_;
    local_4e0._12_4_ = auVar147._12_4_ + auVar147._12_4_;
    local_4e0._16_4_ = auVar147._16_4_ + auVar147._16_4_;
    local_4e0._20_4_ = auVar147._20_4_ + auVar147._20_4_;
    local_4e0._24_4_ = auVar147._24_4_ + auVar147._24_4_;
    local_4e0._28_4_ = auVar147._28_4_ + auVar147._28_4_;
    auVar97 = vsubps_avx(_local_6e0,auVar41);
    local_880._28_4_ = DAT_01fec480._28_4_;
    local_880._0_28_ =
         ZEXT1628(CONCAT412(fVar240 * fVar240,
                            CONCAT48(fVar239 * fVar239,CONCAT44(fVar238 * fVar238,fVar235 * fVar235)
                                    )));
    local_8c0 = vsubps_avx(local_2c0,local_880);
    local_740._4_4_ = local_4e0._4_4_ * local_4e0._4_4_;
    local_740._0_4_ = local_4e0._0_4_ * local_4e0._0_4_;
    local_740._8_4_ = local_4e0._8_4_ * local_4e0._8_4_;
    local_740._12_4_ = local_4e0._12_4_ * local_4e0._12_4_;
    local_740._16_4_ = local_4e0._16_4_ * local_4e0._16_4_;
    local_740._20_4_ = local_4e0._20_4_ * local_4e0._20_4_;
    local_740._24_4_ = local_4e0._24_4_ * local_4e0._24_4_;
    local_740._28_4_ = fVar211;
    fVar132 = local_8c0._0_4_;
    local_5a0._0_4_ = fVar132 * 4.0;
    fVar133 = local_8c0._4_4_;
    local_5a0._4_4_ = fVar133 * 4.0;
    fVar196 = local_8c0._8_4_;
    fStack_598 = fVar196 * 4.0;
    fVar208 = local_8c0._12_4_;
    fStack_594 = fVar208 * 4.0;
    fVar209 = local_8c0._16_4_;
    fStack_590 = fVar209 * 4.0;
    fVar210 = local_8c0._20_4_;
    fStack_58c = fVar210 * 4.0;
    fVar211 = local_8c0._24_4_;
    fStack_588 = fVar211 * 4.0;
    uStack_584 = 0x40800000;
    auVar42._4_4_ = (float)local_5a0._4_4_ * auVar97._4_4_;
    auVar42._0_4_ = (float)local_5a0._0_4_ * auVar97._0_4_;
    auVar42._8_4_ = fStack_598 * auVar97._8_4_;
    auVar42._12_4_ = fStack_594 * auVar97._12_4_;
    auVar42._16_4_ = fStack_590 * auVar97._16_4_;
    auVar42._20_4_ = fStack_58c * auVar97._20_4_;
    auVar42._24_4_ = fStack_588 * auVar97._24_4_;
    auVar42._28_4_ = 0x40800000;
    auVar147 = vsubps_avx(local_740,auVar42);
    auVar127 = vcmpps_avx(auVar147,ZEXT432(0) << 0x20,5);
    local_500 = ZEXT1632(auVar4);
    fVar130 = local_8c0._28_4_;
    if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar127 >> 0x7f,0) == '\0') &&
          (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar127 >> 0xbf,0) == '\0') &&
        (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar127[0x1f])
    {
      auVar264._8_4_ = 0x7f800000;
      auVar264._0_8_ = 0x7f8000007f800000;
      auVar264._12_4_ = 0x7f800000;
      auVar264._16_4_ = 0x7f800000;
      auVar264._20_4_ = 0x7f800000;
      auVar264._24_4_ = 0x7f800000;
      auVar264._28_4_ = 0x7f800000;
      auVar189._8_4_ = 0xff800000;
      auVar189._0_8_ = 0xff800000ff800000;
      auVar189._12_4_ = 0xff800000;
      auVar189._16_4_ = 0xff800000;
      auVar189._20_4_ = 0xff800000;
      auVar189._24_4_ = 0xff800000;
      auVar189._28_4_ = 0xff800000;
    }
    else {
      auVar170 = vsqrtps_avx(auVar147);
      auVar265._0_4_ = fVar132 + fVar132;
      auVar265._4_4_ = fVar133 + fVar133;
      auVar265._8_4_ = fVar196 + fVar196;
      auVar265._12_4_ = fVar208 + fVar208;
      auVar265._16_4_ = fVar209 + fVar209;
      auVar265._20_4_ = fVar210 + fVar210;
      auVar265._24_4_ = fVar211 + fVar211;
      auVar265._28_4_ = fVar130 + fVar130;
      auVar144 = vrcpps_avx(auVar265);
      auVar143 = vcmpps_avx(auVar147,ZEXT432(0) << 0x20,5);
      auVar190._8_4_ = 0x3f800000;
      auVar190._0_8_ = 0x3f8000003f800000;
      auVar190._12_4_ = 0x3f800000;
      auVar190._16_4_ = 0x3f800000;
      auVar190._20_4_ = 0x3f800000;
      auVar190._24_4_ = 0x3f800000;
      auVar190._28_4_ = 0x3f800000;
      auVar4 = vfnmadd213ps_fma(auVar265,auVar144,auVar190);
      auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar144,auVar144);
      auVar191._0_4_ = (uint)local_4e0._0_4_ ^ local_540;
      auVar191._4_4_ = (uint)local_4e0._4_4_ ^ uStack_53c;
      auVar191._8_4_ = (uint)local_4e0._8_4_ ^ uStack_538;
      auVar191._12_4_ = (uint)local_4e0._12_4_ ^ uStack_534;
      auVar191._16_4_ = (uint)local_4e0._16_4_ ^ (uint)fStack_530;
      auVar191._20_4_ = (uint)local_4e0._20_4_ ^ (uint)fStack_52c;
      auVar191._24_4_ = (uint)local_4e0._24_4_ ^ (uint)fStack_528;
      auVar191._28_4_ = (uint)local_4e0._28_4_ ^ uStack_524;
      auVar224 = vsubps_avx(auVar191,auVar170);
      auVar43._4_4_ = auVar4._4_4_ * auVar224._4_4_;
      auVar43._0_4_ = auVar4._0_4_ * auVar224._0_4_;
      auVar43._8_4_ = auVar4._8_4_ * auVar224._8_4_;
      auVar43._12_4_ = auVar4._12_4_ * auVar224._12_4_;
      auVar43._16_4_ = auVar224._16_4_ * 0.0;
      auVar43._20_4_ = auVar224._20_4_ * 0.0;
      auVar43._24_4_ = auVar224._24_4_ * 0.0;
      auVar43._28_4_ = auVar224._28_4_;
      auVar147 = vsubps_avx(auVar170,local_4e0);
      auVar44._4_4_ = auVar4._4_4_ * auVar147._4_4_;
      auVar44._0_4_ = auVar4._0_4_ * auVar147._0_4_;
      auVar44._8_4_ = auVar4._8_4_ * auVar147._8_4_;
      auVar44._12_4_ = auVar4._12_4_ * auVar147._12_4_;
      auVar44._16_4_ = auVar147._16_4_ * 0.0;
      auVar44._20_4_ = auVar147._20_4_ * 0.0;
      auVar44._24_4_ = auVar147._24_4_ * 0.0;
      auVar44._28_4_ = auVar144._28_4_;
      auVar4 = vfmadd213ps_fma(ZEXT1632(auVar90),auVar43,local_500);
      local_560 = ZEXT1632(CONCAT412(fVar134 * auVar4._12_4_,
                                     CONCAT48(fVar135 * auVar4._8_4_,
                                              CONCAT44(fVar131 * auVar4._4_4_,fVar109 * auVar4._0_4_
                                                      ))));
      auVar147 = vandps_avx(local_880,local_720);
      auVar147 = vmaxps_avx(local_3a0,auVar147);
      auVar45._4_4_ = auVar147._4_4_ * 1.9073486e-06;
      auVar45._0_4_ = auVar147._0_4_ * 1.9073486e-06;
      auVar45._8_4_ = auVar147._8_4_ * 1.9073486e-06;
      auVar45._12_4_ = auVar147._12_4_ * 1.9073486e-06;
      auVar45._16_4_ = auVar147._16_4_ * 1.9073486e-06;
      auVar45._20_4_ = auVar147._20_4_ * 1.9073486e-06;
      auVar45._24_4_ = auVar147._24_4_ * 1.9073486e-06;
      auVar45._28_4_ = auVar147._28_4_;
      auVar147 = vandps_avx(local_8c0,local_720);
      auVar147 = vcmpps_avx(auVar147,auVar45,1);
      auVar4 = vfmadd213ps_fma(ZEXT1632(auVar90),auVar44,local_500);
      auVar228._8_4_ = 0x7f800000;
      auVar228._0_8_ = 0x7f8000007f800000;
      auVar228._12_4_ = 0x7f800000;
      auVar228._16_4_ = 0x7f800000;
      auVar228._20_4_ = 0x7f800000;
      auVar228._24_4_ = 0x7f800000;
      auVar228._28_4_ = 0x7f800000;
      auVar264 = vblendvps_avx(auVar228,auVar43,auVar143);
      _local_580 = ZEXT1628(CONCAT412(auVar4._12_4_ * fVar134,
                                      CONCAT48(auVar4._8_4_ * fVar135,
                                               CONCAT44(auVar4._4_4_ * fVar131,
                                                        auVar4._0_4_ * fVar109))));
      uStack_564 = auVar224._28_4_;
      auVar192._8_4_ = 0xff800000;
      auVar192._0_8_ = 0xff800000ff800000;
      auVar192._12_4_ = 0xff800000;
      auVar192._16_4_ = 0xff800000;
      auVar192._20_4_ = 0xff800000;
      auVar192._24_4_ = 0xff800000;
      auVar192._28_4_ = 0xff800000;
      auVar189 = vblendvps_avx(auVar192,auVar44,auVar143);
      auVar144 = auVar143 & auVar147;
      if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar144 >> 0x7f,0) != '\0') ||
            (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar144 >> 0xbf,0) != '\0') ||
          (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar144[0x1f] < '\0') {
        auVar127 = vandps_avx(auVar147,auVar143);
        auVar147 = vcmpps_avx(auVar97,ZEXT832(0) << 0x20,2);
        auVar229._8_4_ = 0xff800000;
        auVar229._0_8_ = 0xff800000ff800000;
        auVar229._12_4_ = 0xff800000;
        auVar229._16_4_ = 0xff800000;
        auVar229._20_4_ = 0xff800000;
        auVar229._24_4_ = 0xff800000;
        auVar229._28_4_ = 0xff800000;
        auVar258._8_4_ = 0x7f800000;
        auVar258._0_8_ = 0x7f8000007f800000;
        auVar258._12_4_ = 0x7f800000;
        auVar258._16_4_ = 0x7f800000;
        auVar258._20_4_ = 0x7f800000;
        auVar258._24_4_ = 0x7f800000;
        auVar258._28_4_ = 0x7f800000;
        auVar97 = vblendvps_avx(auVar258,auVar229,auVar147);
        auVar4 = vpackssdw_avx(auVar127._0_16_,auVar127._16_16_);
        auVar144 = vpmovsxwd_avx2(auVar4);
        auVar264 = vblendvps_avx(auVar264,auVar97,auVar144);
        auVar97 = vblendvps_avx(auVar229,auVar258,auVar147);
        auVar189 = vblendvps_avx(auVar189,auVar97,auVar144);
        auVar108._0_8_ = auVar127._0_8_ ^ 0xffffffffffffffff;
        auVar108._8_4_ = auVar127._8_4_ ^ 0xffffffff;
        auVar108._12_4_ = auVar127._12_4_ ^ 0xffffffff;
        auVar108._16_4_ = auVar127._16_4_ ^ 0xffffffff;
        auVar108._20_4_ = auVar127._20_4_ ^ 0xffffffff;
        auVar108._24_4_ = auVar127._24_4_ ^ 0xffffffff;
        auVar108._28_4_ = auVar127._28_4_ ^ 0xffffffff;
        auVar127 = vorps_avx(auVar147,auVar108);
        auVar127 = vandps_avx(auVar143,auVar127);
      }
    }
    auVar147 = local_380 & auVar127;
    auVar97 = _local_6a0;
    local_8c0._0_8_ = uVar74;
    if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar147 >> 0x7f,0) == '\0') &&
          (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar147 >> 0xbf,0) == '\0') &&
        (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar147[0x1f])
    {
LAB_018687ff:
      auVar248 = ZEXT3264(auVar246);
      auVar237 = ZEXT3264(auVar97);
      auVar254 = ZEXT3264(local_9a0);
      auVar261 = ZEXT3264(local_9c0);
      auVar267 = ZEXT3264(local_9e0);
      auVar231 = ZEXT3264(local_940);
      auVar234 = ZEXT3264(local_a00);
    }
    else {
      auVar144 = local_880;
      fVar235 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_770._0_4_;
      auVar101._4_4_ = fVar235;
      auVar101._0_4_ = fVar235;
      auVar101._8_4_ = fVar235;
      auVar101._12_4_ = fVar235;
      auVar101._16_4_ = fVar235;
      auVar101._20_4_ = fVar235;
      auVar101._24_4_ = fVar235;
      auVar101._28_4_ = fVar235;
      auVar147 = vmaxps_avx(auVar101,auVar264);
      fVar235 = (ray->super_RayK<1>).tfar - (float)local_770._0_4_;
      auVar204._4_4_ = fVar235;
      auVar204._0_4_ = fVar235;
      auVar204._8_4_ = fVar235;
      auVar204._12_4_ = fVar235;
      auVar204._16_4_ = fVar235;
      auVar204._20_4_ = fVar235;
      auVar204._24_4_ = fVar235;
      auVar204._28_4_ = fVar235;
      auVar143 = vminps_avx(auVar204,auVar189);
      auVar146._0_4_ = local_600._0_4_ * fVar212;
      auVar146._4_4_ = local_600._4_4_ * fVar213;
      auVar146._8_4_ = local_600._8_4_ * fVar175;
      auVar146._12_4_ = local_600._12_4_ * fVar176;
      auVar146._16_4_ = local_600._16_4_ * fVar177;
      auVar146._20_4_ = local_600._20_4_ * fVar178;
      auVar146._24_4_ = local_600._24_4_ * fVar179;
      auVar146._28_4_ = 0;
      auVar4 = vfmadd213ps_fma(auVar14,local_920,auVar146);
      auVar182 = vfmadd213ps_fma(auVar246,local_7c0,ZEXT1632(auVar4));
      auVar169._0_4_ = local_6c0 * local_600._0_4_;
      auVar169._4_4_ = fStack_6bc * local_600._4_4_;
      auVar169._8_4_ = fStack_6b8 * local_600._8_4_;
      auVar169._12_4_ = fStack_6b4 * local_600._12_4_;
      auVar169._16_4_ = fStack_6b0 * local_600._16_4_;
      auVar169._20_4_ = fStack_6ac * local_600._20_4_;
      auVar169._24_4_ = fStack_6a8 * local_600._24_4_;
      auVar169._28_4_ = 0;
      auVar4 = vfmadd231ps_fma(auVar169,_local_6a0,local_920);
      auVar141 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_680,local_7c0);
      auVar97 = vandps_avx(local_720,ZEXT1632(auVar141));
      auVar257._8_4_ = 0x219392ef;
      auVar257._0_8_ = 0x219392ef219392ef;
      auVar257._12_4_ = 0x219392ef;
      auVar257._16_4_ = 0x219392ef;
      auVar257._20_4_ = 0x219392ef;
      auVar257._24_4_ = 0x219392ef;
      auVar257._28_4_ = 0x219392ef;
      auVar14 = vcmpps_avx(auVar97,auVar257,1);
      auVar97 = vrcpps_avx(ZEXT1632(auVar141));
      auVar222._8_4_ = 0x3f800000;
      auVar222._0_8_ = 0x3f8000003f800000;
      auVar222._12_4_ = 0x3f800000;
      auVar222._16_4_ = 0x3f800000;
      auVar222._20_4_ = 0x3f800000;
      auVar222._24_4_ = 0x3f800000;
      auVar222._28_4_ = 0x3f800000;
      auVar223 = ZEXT3264(auVar222);
      auVar170 = ZEXT1632(auVar141);
      auVar4 = vfnmadd213ps_fma(auVar97,auVar170,auVar222);
      auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar97,auVar97);
      auVar245._0_4_ = local_540 ^ auVar141._0_4_;
      auVar245._4_4_ = uStack_53c ^ auVar141._4_4_;
      auVar245._8_4_ = uStack_538 ^ auVar141._8_4_;
      auVar245._12_4_ = uStack_534 ^ auVar141._12_4_;
      auVar245._16_4_ = fStack_530;
      auVar245._20_4_ = fStack_52c;
      auVar245._24_4_ = fStack_528;
      auVar245._28_4_ = uStack_524;
      auVar46._4_4_ = auVar4._4_4_ * (float)(auVar182._4_4_ ^ uStack_53c);
      auVar46._0_4_ = auVar4._0_4_ * (float)(auVar182._0_4_ ^ local_540);
      auVar46._8_4_ = auVar4._8_4_ * (float)(auVar182._8_4_ ^ uStack_538);
      auVar46._12_4_ = auVar4._12_4_ * (float)(auVar182._12_4_ ^ uStack_534);
      auVar46._16_4_ = fStack_530 * 0.0;
      auVar46._20_4_ = fStack_52c * 0.0;
      auVar46._24_4_ = fStack_528 * 0.0;
      auVar46._28_4_ = uStack_524;
      auVar97 = vcmpps_avx(auVar170,auVar245,1);
      auVar97 = vorps_avx(auVar14,auVar97);
      auVar266._8_4_ = 0xff800000;
      auVar266._0_8_ = 0xff800000ff800000;
      auVar266._12_4_ = 0xff800000;
      auVar266._16_4_ = 0xff800000;
      auVar266._20_4_ = 0xff800000;
      auVar266._24_4_ = 0xff800000;
      auVar266._28_4_ = 0xff800000;
      auVar97 = vblendvps_avx(auVar46,auVar266,auVar97);
      auVar147 = vmaxps_avx(auVar147,auVar97);
      auVar97 = vcmpps_avx(auVar170,auVar245,6);
      auVar97 = vorps_avx(auVar14,auVar97);
      auVar246._8_4_ = 0x7f800000;
      auVar246._0_8_ = 0x7f8000007f800000;
      auVar246._12_4_ = 0x7f800000;
      auVar246._16_4_ = 0x7f800000;
      auVar246._20_4_ = 0x7f800000;
      auVar246._24_4_ = 0x7f800000;
      auVar246._28_4_ = 0x7f800000;
      auVar97 = vblendvps_avx(auVar46,auVar246,auVar97);
      auVar143 = vminps_avx(auVar143,auVar97);
      fVar212 = (float)(local_540 ^ (uint)local_a40._0_4_);
      fVar213 = (float)(uStack_53c ^ (uint)local_a40._4_4_);
      fVar175 = (float)(uStack_538 ^ (uint)local_a40._8_4_);
      fVar176 = (float)(uStack_534 ^ (uint)local_a40._12_4_);
      fVar177 = (float)((uint)fStack_530 ^ (uint)local_a40._16_4_);
      fVar178 = (float)((uint)fStack_52c ^ (uint)local_a40._20_4_);
      fVar179 = (float)((uint)fStack_528 ^ (uint)local_a40._24_4_);
      auVar193._0_4_ = local_540 ^ (uint)local_840._0_4_;
      auVar193._4_4_ = uStack_53c ^ (uint)local_840._4_4_;
      auVar193._8_4_ = uStack_538 ^ (uint)local_840._8_4_;
      auVar193._12_4_ = uStack_534 ^ (uint)local_840._12_4_;
      auVar193._16_4_ = (uint)fStack_530 ^ (uint)local_840._16_4_;
      auVar193._20_4_ = (uint)fStack_52c ^ (uint)local_840._20_4_;
      auVar193._24_4_ = (uint)fStack_528 ^ (uint)local_840._24_4_;
      auVar193._28_4_ = uStack_524 ^ local_840._28_4_;
      auVar97 = vsubps_avx(ZEXT832(0) << 0x20,local_8a0);
      auVar14 = vsubps_avx(ZEXT832(0) << 0x20,_local_7a0);
      auVar47._4_4_ = auVar14._4_4_ * fVar213;
      auVar47._0_4_ = auVar14._0_4_ * fVar212;
      auVar47._8_4_ = auVar14._8_4_ * fVar175;
      auVar47._12_4_ = auVar14._12_4_ * fVar176;
      auVar47._16_4_ = auVar14._16_4_ * fVar177;
      auVar47._20_4_ = auVar14._20_4_ * fVar178;
      auVar47._24_4_ = auVar14._24_4_ * fVar179;
      auVar47._28_4_ = auVar14._28_4_;
      auVar4 = vfmadd231ps_fma(auVar47,auVar193,auVar97);
      auVar205._0_4_ = local_540 ^ (uint)local_a20._0_4_;
      auVar205._4_4_ = uStack_53c ^ (uint)local_a20._4_4_;
      auVar205._8_4_ = uStack_538 ^ (uint)local_a20._8_4_;
      auVar205._12_4_ = uStack_534 ^ (uint)local_a20._12_4_;
      auVar205._16_4_ = (uint)fStack_530 ^ (uint)local_a20._16_4_;
      auVar205._20_4_ = (uint)fStack_52c ^ (uint)local_a20._20_4_;
      auVar205._24_4_ = (uint)fStack_528 ^ (uint)local_a20._24_4_;
      auVar205._28_4_ = uStack_524 ^ local_a20._28_4_;
      auVar97 = vsubps_avx(ZEXT832(0) << 0x20,auVar15);
      auVar182 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar205,auVar97);
      auVar48._4_4_ = fVar213 * fStack_6bc;
      auVar48._0_4_ = fVar212 * local_6c0;
      auVar48._8_4_ = fVar175 * fStack_6b8;
      auVar48._12_4_ = fVar176 * fStack_6b4;
      auVar48._16_4_ = fVar177 * fStack_6b0;
      auVar48._20_4_ = fVar178 * fStack_6ac;
      auVar48._24_4_ = fVar179 * fStack_6a8;
      auVar48._28_4_ = uStack_524 ^ local_a40._28_4_;
      auVar4 = vfmadd231ps_fma(auVar48,auVar193,_local_6a0);
      auVar141 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar205,_local_680);
      auVar97 = vandps_avx(local_720,ZEXT1632(auVar141));
      auVar15 = vrcpps_avx(ZEXT1632(auVar141));
      auVar14 = vcmpps_avx(auVar97,auVar257,1);
      auVar170 = ZEXT1632(auVar141);
      auVar4 = vfnmadd213ps_fma(auVar15,auVar170,auVar222);
      auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar15,auVar15);
      auVar206._0_4_ = local_540 ^ auVar141._0_4_;
      auVar206._4_4_ = uStack_53c ^ auVar141._4_4_;
      auVar206._8_4_ = uStack_538 ^ auVar141._8_4_;
      auVar206._12_4_ = uStack_534 ^ auVar141._12_4_;
      auVar206._16_4_ = fStack_530;
      auVar206._20_4_ = fStack_52c;
      auVar206._24_4_ = fStack_528;
      auVar206._28_4_ = uStack_524;
      auVar49._4_4_ = auVar4._4_4_ * (float)(uStack_53c ^ auVar182._4_4_);
      auVar49._0_4_ = auVar4._0_4_ * (float)(local_540 ^ auVar182._0_4_);
      auVar49._8_4_ = auVar4._8_4_ * (float)(uStack_538 ^ auVar182._8_4_);
      auVar49._12_4_ = auVar4._12_4_ * (float)(uStack_534 ^ auVar182._12_4_);
      auVar49._16_4_ = fStack_530 * 0.0;
      auVar49._20_4_ = fStack_52c * 0.0;
      auVar49._24_4_ = fStack_528 * 0.0;
      auVar49._28_4_ = uStack_524;
      auVar97 = vcmpps_avx(auVar170,auVar206,1);
      auVar97 = vorps_avx(auVar97,auVar14);
      auVar97 = vblendvps_avx(auVar49,auVar266,auVar97);
      _local_520 = vmaxps_avx(auVar147,auVar97);
      auVar147 = vcmpps_avx(auVar170,auVar206,6);
      auVar14 = vorps_avx(auVar14,auVar147);
      auVar14 = vblendvps_avx(auVar49,auVar246,auVar14);
      auVar127 = vandps_avx(auVar127,local_380);
      local_400 = vminps_avx(auVar143,auVar14);
      auVar14 = vcmpps_avx(_local_520,local_400,2);
      auVar147 = auVar127 & auVar14;
      if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar147 >> 0x7f,0) == '\0') &&
            (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar147 >> 0xbf,0) == '\0') &&
          (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar147[0x1f]) goto LAB_018687ff;
      auVar15 = _local_520;
      auVar97 = vminps_avx(local_560,auVar222);
      auVar97 = vmaxps_avx(auVar97,ZEXT832(0) << 0x20);
      auVar147 = vminps_avx(_local_580,auVar222);
      auVar147 = vmaxps_avx(auVar147,ZEXT832(0) << 0x20);
      auVar50._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
      auVar50._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
      auVar50._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
      auVar50._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
      auVar50._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
      auVar50._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
      auVar50._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
      auVar50._28_4_ = auVar97._28_4_ + 7.0;
      auVar4 = vfmadd213ps_fma(auVar50,local_620,local_700);
      auVar51._4_4_ = (auVar147._4_4_ + 1.0) * 0.125;
      auVar51._0_4_ = (auVar147._0_4_ + 0.0) * 0.125;
      auVar51._8_4_ = (auVar147._8_4_ + 2.0) * 0.125;
      auVar51._12_4_ = (auVar147._12_4_ + 3.0) * 0.125;
      auVar51._16_4_ = (auVar147._16_4_ + 4.0) * 0.125;
      auVar51._20_4_ = (auVar147._20_4_ + 5.0) * 0.125;
      auVar51._24_4_ = (auVar147._24_4_ + 6.0) * 0.125;
      auVar51._28_4_ = auVar147._28_4_ + 7.0;
      auVar182 = vfmadd213ps_fma(auVar51,local_620,local_700);
      auVar97 = vminps_avx(_local_800,local_640);
      auVar147 = vminps_avx(local_660,local_820);
      auVar97 = vminps_avx(auVar97,auVar147);
      auVar147 = vsubps_avx(auVar97,local_760);
      auVar127 = vandps_avx(auVar14,auVar127);
      local_1a0 = ZEXT1632(auVar4);
      local_1c0 = ZEXT1632(auVar182);
      auVar52._4_4_ = auVar147._4_4_ * 0.99999976;
      auVar52._0_4_ = auVar147._0_4_ * 0.99999976;
      auVar52._8_4_ = auVar147._8_4_ * 0.99999976;
      auVar52._12_4_ = auVar147._12_4_ * 0.99999976;
      auVar52._16_4_ = auVar147._16_4_ * 0.99999976;
      auVar52._20_4_ = auVar147._20_4_ * 0.99999976;
      auVar52._24_4_ = auVar147._24_4_ * 0.99999976;
      auVar52._28_4_ = 0x3f7ffffc;
      auVar97 = vmaxps_avx(ZEXT832(0) << 0x20,auVar52);
      auVar53._4_4_ = auVar97._4_4_ * auVar97._4_4_;
      auVar53._0_4_ = auVar97._0_4_ * auVar97._0_4_;
      auVar53._8_4_ = auVar97._8_4_ * auVar97._8_4_;
      auVar53._12_4_ = auVar97._12_4_ * auVar97._12_4_;
      auVar53._16_4_ = auVar97._16_4_ * auVar97._16_4_;
      auVar53._20_4_ = auVar97._20_4_ * auVar97._20_4_;
      auVar53._24_4_ = auVar97._24_4_ * auVar97._24_4_;
      auVar53._28_4_ = auVar97._28_4_;
      auVar14 = vsubps_avx(_local_6e0,auVar53);
      auVar54._4_4_ = auVar14._4_4_ * (float)local_5a0._4_4_;
      auVar54._0_4_ = auVar14._0_4_ * (float)local_5a0._0_4_;
      auVar54._8_4_ = auVar14._8_4_ * fStack_598;
      auVar54._12_4_ = auVar14._12_4_ * fStack_594;
      auVar54._16_4_ = auVar14._16_4_ * fStack_590;
      auVar54._20_4_ = auVar14._20_4_ * fStack_58c;
      auVar54._24_4_ = auVar14._24_4_ * fStack_588;
      auVar54._28_4_ = auVar97._28_4_;
      auVar97 = vsubps_avx(local_740,auVar54);
      local_8a0 = vcmpps_avx(auVar97,ZEXT832(0) << 0x20,5);
      if ((((((((local_8a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_8a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_8a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_8a0 >> 0x7f,0) == '\0') &&
            (local_8a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_8a0 >> 0xbf,0) == '\0') &&
          (local_8a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_8a0[0x1f]) {
        auVar64 = ZEXT412(0);
        auVar98 = ZEXT1232(auVar64) << 0x20;
        local_740 = ZEXT1232(auVar64) << 0x20;
        local_760 = ZEXT1232(auVar64) << 0x20;
        _local_5a0 = ZEXT1232(auVar64) << 0x20;
        auVar168 = ZEXT1232(ZEXT812(0)) << 0x20;
        _local_ae0 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar207._8_4_ = 0x7f800000;
        auVar207._0_8_ = 0x7f8000007f800000;
        auVar207._12_4_ = 0x7f800000;
        auVar207._16_4_ = 0x7f800000;
        auVar207._20_4_ = 0x7f800000;
        auVar207._24_4_ = 0x7f800000;
        auVar207._28_4_ = 0x7f800000;
        auVar215._8_4_ = 0xff800000;
        auVar215._0_8_ = 0xff800000ff800000;
        auVar215._12_4_ = 0xff800000;
        auVar215._16_4_ = 0xff800000;
        auVar215._20_4_ = 0xff800000;
        auVar215._24_4_ = 0xff800000;
        auVar215._28_4_ = 0xff800000;
      }
      else {
        auVar170 = vsqrtps_avx(auVar97);
        auVar171._0_4_ = fVar132 + fVar132;
        auVar171._4_4_ = fVar133 + fVar133;
        auVar171._8_4_ = fVar196 + fVar196;
        auVar171._12_4_ = fVar208 + fVar208;
        auVar171._16_4_ = fVar209 + fVar209;
        auVar171._20_4_ = fVar210 + fVar210;
        auVar171._24_4_ = fVar211 + fVar211;
        auVar171._28_4_ = fVar130 + fVar130;
        auVar143 = vrcpps_avx(auVar171);
        auVar4 = vfnmadd213ps_fma(auVar171,auVar143,auVar222);
        auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar143,auVar143);
        auVar194._0_4_ = (uint)local_4e0._0_4_ ^ local_540;
        auVar194._4_4_ = (uint)local_4e0._4_4_ ^ uStack_53c;
        auVar194._8_4_ = (uint)local_4e0._8_4_ ^ uStack_538;
        auVar194._12_4_ = (uint)local_4e0._12_4_ ^ uStack_534;
        auVar194._16_4_ = (uint)local_4e0._16_4_ ^ (uint)fStack_530;
        auVar194._20_4_ = (uint)local_4e0._20_4_ ^ (uint)fStack_52c;
        auVar194._24_4_ = (uint)local_4e0._24_4_ ^ (uint)fStack_528;
        auVar194._28_4_ = (uint)local_4e0._28_4_ ^ uStack_524;
        auVar143 = vsubps_avx(auVar194,auVar170);
        auVar170 = vsubps_avx(auVar170,local_4e0);
        fVar130 = auVar143._0_4_ * auVar4._0_4_;
        fVar132 = auVar143._4_4_ * auVar4._4_4_;
        auVar55._4_4_ = fVar132;
        auVar55._0_4_ = fVar130;
        fVar133 = auVar143._8_4_ * auVar4._8_4_;
        auVar55._8_4_ = fVar133;
        fVar196 = auVar143._12_4_ * auVar4._12_4_;
        auVar55._12_4_ = fVar196;
        fVar208 = auVar143._16_4_ * 0.0;
        auVar55._16_4_ = fVar208;
        fVar209 = auVar143._20_4_ * 0.0;
        auVar55._20_4_ = fVar209;
        fVar210 = auVar143._24_4_ * 0.0;
        auVar55._24_4_ = fVar210;
        auVar55._28_4_ = auVar147._28_4_;
        fVar211 = auVar170._0_4_ * auVar4._0_4_;
        fVar212 = auVar170._4_4_ * auVar4._4_4_;
        auVar56._4_4_ = fVar212;
        auVar56._0_4_ = fVar211;
        fVar213 = auVar170._8_4_ * auVar4._8_4_;
        auVar56._8_4_ = fVar213;
        fVar175 = auVar170._12_4_ * auVar4._12_4_;
        auVar56._12_4_ = fVar175;
        fVar176 = auVar170._16_4_ * 0.0;
        auVar56._16_4_ = fVar176;
        fVar177 = auVar170._20_4_ * 0.0;
        auVar56._20_4_ = fVar177;
        fVar178 = auVar170._24_4_ * 0.0;
        auVar56._24_4_ = fVar178;
        auVar56._28_4_ = 0x219392ef;
        auVar4 = vfmadd213ps_fma(ZEXT1632(auVar90),auVar55,local_500);
        auVar90 = vfmadd213ps_fma(ZEXT1632(auVar90),auVar56,local_500);
        auVar57._28_4_ = auVar143._28_4_;
        auVar57._0_28_ =
             ZEXT1628(CONCAT412(fVar134 * auVar4._12_4_,
                                CONCAT48(fVar135 * auVar4._8_4_,
                                         CONCAT44(fVar131 * auVar4._4_4_,fVar109 * auVar4._0_4_))));
        auVar147 = ZEXT1632(CONCAT412(fVar134 * auVar90._12_4_,
                                      CONCAT48(fVar135 * auVar90._8_4_,
                                               CONCAT44(fVar131 * auVar90._4_4_,
                                                        fVar109 * auVar90._0_4_))));
        auVar90 = vfmadd213ps_fma(_local_5c0,auVar57,auVar168);
        auVar4 = vfmadd213ps_fma(_local_5c0,auVar147,auVar168);
        auVar182 = vfmadd213ps_fma(local_4c0,auVar57,auVar98);
        auVar141 = vfmadd213ps_fma(local_4c0,auVar147,auVar98);
        auVar202 = vfmadd213ps_fma(auVar57,local_4a0,local_480);
        auVar94 = vfmadd213ps_fma(local_4a0,auVar147,local_480);
        auVar58._4_4_ = (float)local_680._4_4_ * fVar132;
        auVar58._0_4_ = (float)local_680._0_4_ * fVar130;
        auVar58._8_4_ = fStack_678 * fVar133;
        auVar58._12_4_ = fStack_674 * fVar196;
        auVar58._16_4_ = fStack_670 * fVar208;
        auVar58._20_4_ = fStack_66c * fVar209;
        auVar58._24_4_ = fStack_668 * fVar210;
        auVar58._28_4_ = 0;
        auVar98 = vsubps_avx(auVar58,ZEXT1632(auVar90));
        auVar172._0_4_ = (float)local_6a0._0_4_ * fVar130;
        auVar172._4_4_ = (float)local_6a0._4_4_ * fVar132;
        auVar172._8_4_ = fStack_698 * fVar133;
        auVar172._12_4_ = fStack_694 * fVar196;
        auVar172._16_4_ = fStack_690 * fVar208;
        auVar172._20_4_ = fStack_68c * fVar209;
        auVar172._24_4_ = fStack_688 * fVar210;
        auVar172._28_4_ = 0;
        auVar168 = vsubps_avx(auVar172,ZEXT1632(auVar182));
        auVar216._0_4_ = local_6c0 * fVar130;
        auVar216._4_4_ = fStack_6bc * fVar132;
        auVar216._8_4_ = fStack_6b8 * fVar133;
        auVar216._12_4_ = fStack_6b4 * fVar196;
        auVar216._16_4_ = fStack_6b0 * fVar208;
        auVar216._20_4_ = fStack_6ac * fVar209;
        auVar216._24_4_ = fStack_6a8 * fVar210;
        auVar216._28_4_ = 0;
        auVar147 = vsubps_avx(auVar216,ZEXT1632(auVar202));
        _local_ae0 = auVar147._0_28_;
        auVar59._4_4_ = (float)local_680._4_4_ * fVar212;
        auVar59._0_4_ = (float)local_680._0_4_ * fVar211;
        auVar59._8_4_ = fStack_678 * fVar213;
        auVar59._12_4_ = fStack_674 * fVar175;
        auVar59._16_4_ = fStack_670 * fVar176;
        auVar59._20_4_ = fStack_66c * fVar177;
        auVar59._24_4_ = fStack_668 * fVar178;
        auVar59._28_4_ = 0;
        local_740 = vsubps_avx(auVar59,ZEXT1632(auVar4));
        auVar60._4_4_ = (float)local_6a0._4_4_ * fVar212;
        auVar60._0_4_ = (float)local_6a0._0_4_ * fVar211;
        auVar60._8_4_ = fStack_698 * fVar213;
        auVar60._12_4_ = fStack_694 * fVar175;
        auVar60._16_4_ = fStack_690 * fVar176;
        auVar60._20_4_ = fStack_68c * fVar177;
        auVar60._24_4_ = fStack_688 * fVar178;
        auVar60._28_4_ = local_740._28_4_;
        local_760 = vsubps_avx(auVar60,ZEXT1632(auVar141));
        auVar61._4_4_ = fStack_6bc * fVar212;
        auVar61._0_4_ = local_6c0 * fVar211;
        auVar61._8_4_ = fStack_6b8 * fVar213;
        auVar61._12_4_ = fStack_6b4 * fVar175;
        auVar61._16_4_ = fStack_6b0 * fVar176;
        auVar61._20_4_ = fStack_6ac * fVar177;
        auVar61._24_4_ = fStack_6a8 * fVar178;
        auVar61._28_4_ = local_760._28_4_;
        _local_5a0 = vsubps_avx(auVar61,ZEXT1632(auVar94));
        auVar147 = vcmpps_avx(auVar97,_DAT_01faff00,5);
        auVar217._8_4_ = 0x7f800000;
        auVar217._0_8_ = 0x7f8000007f800000;
        auVar217._12_4_ = 0x7f800000;
        auVar217._16_4_ = 0x7f800000;
        auVar217._20_4_ = 0x7f800000;
        auVar217._24_4_ = 0x7f800000;
        auVar217._28_4_ = 0x7f800000;
        auVar207 = vblendvps_avx(auVar217,auVar55,auVar147);
        auVar97 = vandps_avx(local_720,local_880);
        auVar97 = vmaxps_avx(local_3a0,auVar97);
        auVar62._4_4_ = auVar97._4_4_ * 1.9073486e-06;
        auVar62._0_4_ = auVar97._0_4_ * 1.9073486e-06;
        auVar62._8_4_ = auVar97._8_4_ * 1.9073486e-06;
        auVar62._12_4_ = auVar97._12_4_ * 1.9073486e-06;
        auVar62._16_4_ = auVar97._16_4_ * 1.9073486e-06;
        auVar62._20_4_ = auVar97._20_4_ * 1.9073486e-06;
        auVar62._24_4_ = auVar97._24_4_ * 1.9073486e-06;
        auVar62._28_4_ = auVar97._28_4_;
        auVar97 = vandps_avx(local_720,local_8c0);
        auVar97 = vcmpps_avx(auVar97,auVar62,1);
        auVar218._8_4_ = 0xff800000;
        auVar218._0_8_ = 0xff800000ff800000;
        auVar218._12_4_ = 0xff800000;
        auVar218._16_4_ = 0xff800000;
        auVar218._20_4_ = 0xff800000;
        auVar218._24_4_ = 0xff800000;
        auVar218._28_4_ = 0xff800000;
        auVar215 = vblendvps_avx(auVar218,auVar56,auVar147);
        auVar143 = auVar147 & auVar97;
        if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar143 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar143 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar143 >> 0x7f,0) != '\0') ||
              (auVar143 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar143 >> 0xbf,0) != '\0') ||
            (auVar143 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar143[0x1f] < '\0') {
          auVar97 = vandps_avx(auVar97,auVar147);
          auVar143 = vcmpps_avx(auVar14,ZEXT832(0) << 0x20,2);
          auVar253._8_4_ = 0xff800000;
          auVar253._0_8_ = 0xff800000ff800000;
          auVar253._12_4_ = 0xff800000;
          auVar253._16_4_ = 0xff800000;
          auVar253._20_4_ = 0xff800000;
          auVar253._24_4_ = 0xff800000;
          auVar253._28_4_ = 0xff800000;
          auVar259._8_4_ = 0x7f800000;
          auVar259._0_8_ = 0x7f8000007f800000;
          auVar259._12_4_ = 0x7f800000;
          auVar259._16_4_ = 0x7f800000;
          auVar259._20_4_ = 0x7f800000;
          auVar259._24_4_ = 0x7f800000;
          auVar259._28_4_ = 0x7f800000;
          auVar14 = vblendvps_avx(auVar259,auVar253,auVar143);
          auVar90 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
          auVar170 = vpmovsxwd_avx2(auVar90);
          auVar207 = vblendvps_avx(auVar207,auVar14,auVar170);
          auVar14 = vblendvps_avx(auVar253,auVar259,auVar143);
          auVar215 = vblendvps_avx(auVar215,auVar14,auVar170);
          auVar230._0_8_ = auVar97._0_8_ ^ 0xffffffffffffffff;
          auVar230._8_4_ = auVar97._8_4_ ^ 0xffffffff;
          auVar230._12_4_ = auVar97._12_4_ ^ 0xffffffff;
          auVar230._16_4_ = auVar97._16_4_ ^ 0xffffffff;
          auVar230._20_4_ = auVar97._20_4_ ^ 0xffffffff;
          auVar230._24_4_ = auVar97._24_4_ ^ 0xffffffff;
          auVar230._28_4_ = auVar97._28_4_ ^ 0xffffffff;
          auVar97 = vorps_avx(auVar143,auVar230);
          local_8a0 = vandps_avx(auVar97,auVar147);
        }
      }
      auVar254 = ZEXT3264(local_9a0);
      auVar261 = ZEXT3264(local_9c0);
      auVar267 = ZEXT3264(local_9e0);
      auVar234 = ZEXT3264(local_a00);
      uVar83 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar247._4_4_ = uVar83;
      auVar247._0_4_ = uVar83;
      auVar247._8_4_ = uVar83;
      auVar247._12_4_ = uVar83;
      auVar247._16_4_ = uVar83;
      auVar247._20_4_ = uVar83;
      auVar247._24_4_ = uVar83;
      auVar247._28_4_ = uVar83;
      auVar248 = ZEXT3264(auVar247);
      uVar83 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar195._4_4_ = uVar83;
      auVar195._0_4_ = uVar83;
      auVar195._8_4_ = uVar83;
      auVar195._12_4_ = uVar83;
      auVar195._16_4_ = uVar83;
      auVar195._20_4_ = uVar83;
      auVar195._24_4_ = uVar83;
      auVar195._28_4_ = uVar83;
      fVar109 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar237 = ZEXT3264(_local_520);
      local_3e0 = _local_520;
      local_3c0 = vminps_avx(local_400,auVar207);
      local_420 = vmaxps_avx(_local_520,auVar215);
      auVar97 = vcmpps_avx(_local_520,local_3c0,2);
      local_480 = vandps_avx(auVar97,auVar127);
      auVar97 = vcmpps_avx(local_420,local_400,2);
      local_4c0 = vandps_avx(auVar97,auVar127);
      auVar127 = vorps_avx(local_4c0,local_480);
      if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar127 >> 0x7f,0) == '\0') &&
            (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar127 >> 0xbf,0) == '\0') &&
          (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar127[0x1f]) {
        auVar231 = ZEXT3264(local_940);
      }
      else {
        _local_5c0 = local_420;
        auVar97 = _local_5c0;
        local_4e0._0_8_ = local_8a0._0_8_ ^ 0xffffffffffffffff;
        local_4e0._8_4_ = (float)(local_8a0._8_4_ ^ 0xffffffff);
        local_4e0._12_4_ = (float)(local_8a0._12_4_ ^ 0xffffffff);
        local_4e0._16_4_ = (float)(local_8a0._16_4_ ^ 0xffffffff);
        local_4e0._20_4_ = (float)(local_8a0._20_4_ ^ 0xffffffff);
        local_4e0._24_4_ = (float)(local_8a0._24_4_ ^ 0xffffffff);
        local_4e0._28_4_ = (float)(local_8a0._28_4_ ^ 0xffffffff);
        auVar63._4_4_ = fVar109 * (float)local_ae0._4_4_;
        auVar63._0_4_ = fVar109 * (float)local_ae0._0_4_;
        auVar63._8_4_ = fVar109 * fStack_ad8;
        auVar63._12_4_ = fVar109 * fStack_ad4;
        auVar63._16_4_ = fVar109 * fStack_ad0;
        auVar63._20_4_ = fVar109 * fStack_acc;
        auVar63._24_4_ = fVar109 * fStack_ac8;
        auVar63._28_4_ = local_8a0._28_4_;
        auVar90 = vfmadd213ps_fma(auVar168,auVar195,auVar63);
        auVar90 = vfmadd213ps_fma(auVar98,auVar247,ZEXT1632(auVar90));
        auVar127 = vandps_avx(ZEXT1632(auVar90),local_720);
        auVar125._8_4_ = 0x3e99999a;
        auVar125._0_8_ = 0x3e99999a3e99999a;
        auVar125._12_4_ = 0x3e99999a;
        auVar125._16_4_ = 0x3e99999a;
        auVar125._20_4_ = 0x3e99999a;
        auVar125._24_4_ = 0x3e99999a;
        auVar125._28_4_ = 0x3e99999a;
        auVar127 = vcmpps_avx(auVar127,auVar125,1);
        auVar127 = vorps_avx(auVar127,local_4e0);
        auVar126._8_4_ = 3;
        auVar126._0_8_ = 0x300000003;
        auVar126._12_4_ = 3;
        auVar126._16_4_ = 3;
        auVar126._20_4_ = 3;
        auVar126._24_4_ = 3;
        auVar126._28_4_ = 3;
        auVar148._8_4_ = 2;
        auVar148._0_8_ = 0x200000002;
        auVar148._12_4_ = 2;
        auVar148._16_4_ = 2;
        auVar148._20_4_ = 2;
        auVar148._24_4_ = 2;
        auVar148._28_4_ = 2;
        auVar127 = vblendvps_avx(auVar148,auVar126,auVar127);
        local_500._4_4_ = local_aec;
        local_500._0_4_ = local_aec;
        local_500._8_4_ = local_aec;
        local_500._12_4_ = local_aec;
        local_500._16_4_ = local_aec;
        local_500._20_4_ = local_aec;
        local_500._24_4_ = local_aec;
        local_500._28_4_ = local_aec;
        local_4a0 = vpcmpgtd_avx2(auVar127,local_500);
        local_460 = vpandn_avx2(local_4a0,local_480);
        auVar128 = ZEXT3264(local_460);
        auVar127 = local_480 & ~local_4a0;
        local_a40 = auVar16;
        local_a20 = auVar17;
        local_840 = auVar18;
        if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar127 >> 0x7f,0) == '\0') &&
              (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar127 >> 0xbf,0) == '\0') &&
            (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar127[0x1f]) {
          fVar130 = (ray->super_RayK<1>).tfar;
          auVar105._4_4_ = fVar130;
          auVar105._0_4_ = fVar130;
          auVar105._8_4_ = fVar130;
          auVar105._12_4_ = fVar130;
          auVar105._16_4_ = fVar130;
          auVar105._20_4_ = fVar130;
          auVar105._24_4_ = fVar130;
          auVar105._28_4_ = fVar130;
          local_5c0._0_4_ = local_420._0_4_;
          local_5c0._4_4_ = local_420._4_4_;
          fStack_5b8 = local_420._8_4_;
          fStack_5b4 = local_420._12_4_;
          fStack_5b0 = local_420._16_4_;
          fStack_5ac = local_420._20_4_;
          fStack_5a8 = local_420._24_4_;
          fStack_5a4 = local_420._28_4_;
          local_820 = local_420;
          auVar231 = ZEXT3264(local_940);
          fVar130 = (float)local_5c0._0_4_;
          fVar208 = (float)local_5c0._4_4_;
          fVar209 = fStack_5b8;
          fVar210 = fStack_5b4;
          fVar211 = fStack_5b0;
          fVar212 = fStack_5ac;
          fVar213 = fStack_5a8;
          fVar175 = fStack_5a4;
          fVar131 = fVar109;
          fVar132 = fVar109;
          fVar135 = fVar109;
          fVar133 = fVar109;
          fVar134 = fVar109;
          fVar196 = fVar109;
          _local_5c0 = auVar97;
        }
        else {
          _local_580 = auVar195;
          local_560 = auVar247;
          auVar4 = vminps_avx(local_950,local_970);
          auVar90 = vmaxps_avx(local_950,local_970);
          auVar182 = vminps_avx(local_960,_local_980);
          auVar141 = vminps_avx(auVar4,auVar182);
          auVar4 = vmaxps_avx(local_960,_local_980);
          auVar182 = vmaxps_avx(auVar90,auVar4);
          auVar154._8_4_ = 0x7fffffff;
          auVar154._0_8_ = 0x7fffffff7fffffff;
          auVar154._12_4_ = 0x7fffffff;
          auVar90 = vandps_avx(auVar141,auVar154);
          local_700._0_16_ = auVar154;
          auVar4 = vandps_avx(auVar182,auVar154);
          auVar90 = vmaxps_avx(auVar90,auVar4);
          auVar4 = vmovshdup_avx(auVar90);
          auVar4 = vmaxss_avx(auVar4,auVar90);
          auVar90 = vshufpd_avx(auVar90,auVar90,1);
          auVar90 = vmaxss_avx(auVar90,auVar4);
          local_7c0._0_4_ = auVar90._0_4_ * 1.9073486e-06;
          local_820._0_16_ = vshufps_avx(auVar182,auVar182,0xff);
          local_6e0._4_4_ = (float)local_520._4_4_ + (float)local_7e0._4_4_;
          local_6e0._0_4_ = (float)local_520._0_4_ + (float)local_7e0._0_4_;
          fStack_6d8 = fStack_518 + fStack_7d8;
          fStack_6d4 = fStack_514 + fStack_7d4;
          fStack_6d0 = fStack_510 + fStack_7d0;
          fStack_6cc = fStack_50c + fStack_7cc;
          fStack_6c8 = fStack_508 + fStack_7c8;
          fStack_6c4 = fStack_504 + fStack_7c4;
          local_800._4_4_ = fVar109;
          local_800._0_4_ = fVar109;
          fStack_7f8 = fVar109;
          fStack_7f4 = fVar109;
          fStack_7f0 = fVar109;
          fStack_7ec = fVar109;
          fStack_7e8 = fVar109;
          fStack_7e4 = fVar109;
          local_880 = auVar144;
          local_660 = auVar19;
          _local_520 = auVar15;
          do {
            auVar106._8_4_ = 0x7f800000;
            auVar106._0_8_ = 0x7f8000007f800000;
            auVar106._12_4_ = 0x7f800000;
            auVar106._16_4_ = 0x7f800000;
            auVar106._20_4_ = 0x7f800000;
            auVar106._24_4_ = 0x7f800000;
            auVar106._28_4_ = 0x7f800000;
            auVar127 = auVar128._0_32_;
            auVar97 = vblendvps_avx(auVar106,_local_520,auVar127);
            auVar14 = vshufps_avx(auVar97,auVar97,0xb1);
            auVar14 = vminps_avx(auVar97,auVar14);
            auVar147 = vshufpd_avx(auVar14,auVar14,5);
            auVar14 = vminps_avx(auVar14,auVar147);
            auVar147 = vpermpd_avx2(auVar14,0x4e);
            auVar14 = vminps_avx(auVar14,auVar147);
            auVar97 = vcmpps_avx(auVar97,auVar14,0);
            auVar14 = auVar127 & auVar97;
            if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0x7f,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0xbf,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar14[0x1f] < '\0') {
              auVar127 = vandps_avx(auVar97,auVar127);
            }
            uVar76 = vmovmskps_avx(auVar127);
            iVar20 = 0;
            for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar77 = iVar20 << 2;
            *(undefined4 *)(local_460 + uVar77) = 0;
            aVar2 = (ray->super_RayK<1>).dir.field_0;
            auVar90 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            uVar76 = *(uint *)(local_1a0 + uVar77);
            uVar77 = *(uint *)(local_3e0 + uVar77);
            if (auVar90._0_4_ < 0.0) {
              fVar109 = sqrtf(auVar90._0_4_);
            }
            else {
              auVar90 = vsqrtss_avx(auVar90,auVar90);
              fVar109 = auVar90._0_4_;
            }
            local_620._0_4_ = fVar109 * 1.9073486e-06;
            auVar90 = vinsertps_avx(ZEXT416(uVar77),ZEXT416(uVar76),0x10);
            auVar237 = ZEXT1664(auVar90);
            lVar79 = 5;
            do {
              auVar94 = auVar237._0_16_;
              auVar4 = vmovshdup_avx(auVar94);
              fVar135 = 1.0 - auVar4._0_4_;
              local_920._0_16_ = ZEXT416((uint)fVar135);
              auVar90 = vshufps_avx(auVar94,auVar94,0x55);
              fVar109 = auVar90._0_4_;
              auVar111._0_4_ = local_970._0_4_ * fVar109;
              fVar130 = auVar90._4_4_;
              auVar111._4_4_ = local_970._4_4_ * fVar130;
              fVar131 = auVar90._8_4_;
              auVar111._8_4_ = local_970._8_4_ * fVar131;
              fVar132 = auVar90._12_4_;
              auVar111._12_4_ = local_970._12_4_ * fVar132;
              auVar138._4_4_ = fVar135;
              auVar138._0_4_ = fVar135;
              auVar138._8_4_ = fVar135;
              auVar138._12_4_ = fVar135;
              auVar90 = vfmadd231ps_fma(auVar111,auVar138,local_950);
              auVar155._0_4_ = local_960._0_4_ * fVar109;
              auVar155._4_4_ = local_960._4_4_ * fVar130;
              auVar155._8_4_ = local_960._8_4_ * fVar131;
              auVar155._12_4_ = local_960._12_4_ * fVar132;
              auVar182 = vfmadd231ps_fma(auVar155,auVar138,local_970);
              auVar199._0_4_ = fVar109 * auVar182._0_4_;
              auVar199._4_4_ = fVar130 * auVar182._4_4_;
              auVar199._8_4_ = fVar131 * auVar182._8_4_;
              auVar199._12_4_ = fVar132 * auVar182._12_4_;
              auVar141 = vfmadd231ps_fma(auVar199,auVar138,auVar90);
              auVar112._0_4_ = fVar109 * (float)local_980._0_4_;
              auVar112._4_4_ = fVar130 * (float)local_980._4_4_;
              auVar112._8_4_ = fVar131 * fStack_978;
              auVar112._12_4_ = fVar132 * fStack_974;
              auVar90 = vfmadd231ps_fma(auVar112,auVar138,local_960);
              auVar181._0_4_ = fVar109 * auVar90._0_4_;
              auVar181._4_4_ = fVar130 * auVar90._4_4_;
              auVar181._8_4_ = fVar131 * auVar90._8_4_;
              auVar181._12_4_ = fVar132 * auVar90._12_4_;
              auVar182 = vfmadd231ps_fma(auVar181,auVar138,auVar182);
              fVar133 = auVar237._0_4_;
              auVar113._4_4_ = fVar133;
              auVar113._0_4_ = fVar133;
              auVar113._8_4_ = fVar133;
              auVar113._12_4_ = fVar133;
              auVar90 = vfmadd213ps_fma(auVar113,(undefined1  [16])aVar2,_DAT_01f7aa10);
              auVar89._0_4_ = fVar109 * auVar182._0_4_;
              auVar89._4_4_ = fVar130 * auVar182._4_4_;
              auVar89._8_4_ = fVar131 * auVar182._8_4_;
              auVar89._12_4_ = fVar132 * auVar182._12_4_;
              auVar202 = vfmadd231ps_fma(auVar89,auVar141,auVar138);
              local_600._0_16_ = auVar202;
              auVar90 = vsubps_avx(auVar90,auVar202);
              _local_7a0 = auVar90;
              auVar90 = vdpps_avx(auVar90,auVar90,0x7f);
              local_8a0._0_16_ = auVar90;
              if (auVar90._0_4_ < 0.0) {
                local_920._0_16_ = ZEXT416((uint)fVar135);
                local_a20._0_16_ = auVar141;
                local_a40._0_16_ = auVar182;
                auVar254._0_4_ = sqrtf(auVar90._0_4_);
                auVar254._4_60_ = extraout_var;
                auVar90 = auVar254._0_16_;
                auVar182 = local_a40._0_16_;
                auVar141 = local_a20._0_16_;
              }
              else {
                auVar90 = vsqrtss_avx(auVar90,auVar90);
              }
              auVar182 = vsubps_avx(auVar182,auVar141);
              auVar214._0_4_ = auVar182._0_4_ * 3.0;
              auVar214._4_4_ = auVar182._4_4_ * 3.0;
              auVar214._8_4_ = auVar182._8_4_ * 3.0;
              auVar214._12_4_ = auVar182._12_4_ * 3.0;
              auVar182 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920._0_16_,auVar4);
              auVar141 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar4,local_920._0_16_);
              fVar109 = local_920._0_4_ * 6.0;
              fVar130 = auVar182._0_4_ * 6.0;
              fVar131 = auVar141._0_4_ * 6.0;
              fVar132 = auVar4._0_4_ * 6.0;
              auVar156._0_4_ = fVar132 * (float)local_980._0_4_;
              auVar156._4_4_ = fVar132 * (float)local_980._4_4_;
              auVar156._8_4_ = fVar132 * fStack_978;
              auVar156._12_4_ = fVar132 * fStack_974;
              auVar114._4_4_ = fVar131;
              auVar114._0_4_ = fVar131;
              auVar114._8_4_ = fVar131;
              auVar114._12_4_ = fVar131;
              auVar4 = vfmadd132ps_fma(auVar114,auVar156,local_960);
              auVar157._4_4_ = fVar130;
              auVar157._0_4_ = fVar130;
              auVar157._8_4_ = fVar130;
              auVar157._12_4_ = fVar130;
              auVar4 = vfmadd132ps_fma(auVar157,auVar4,local_970);
              auVar182 = vdpps_avx(auVar214,auVar214,0x7f);
              auVar115._4_4_ = fVar109;
              auVar115._0_4_ = fVar109;
              auVar115._8_4_ = fVar109;
              auVar115._12_4_ = fVar109;
              auVar202 = vfmadd132ps_fma(auVar115,auVar4,local_950);
              auVar4 = vblendps_avx(auVar182,_DAT_01f7aa10,0xe);
              auVar141 = vrsqrtss_avx(auVar4,auVar4);
              fVar131 = auVar182._0_4_;
              fVar109 = auVar141._0_4_;
              auVar141 = vdpps_avx(auVar214,auVar202,0x7f);
              fVar109 = fVar109 * 1.5 + fVar131 * -0.5 * fVar109 * fVar109 * fVar109;
              auVar116._0_4_ = auVar202._0_4_ * fVar131;
              auVar116._4_4_ = auVar202._4_4_ * fVar131;
              auVar116._8_4_ = auVar202._8_4_ * fVar131;
              auVar116._12_4_ = auVar202._12_4_ * fVar131;
              fVar130 = auVar141._0_4_;
              auVar200._0_4_ = auVar214._0_4_ * fVar130;
              auVar200._4_4_ = auVar214._4_4_ * fVar130;
              auVar200._8_4_ = auVar214._8_4_ * fVar130;
              auVar200._12_4_ = auVar214._12_4_ * fVar130;
              auVar141 = vsubps_avx(auVar116,auVar200);
              auVar4 = vrcpss_avx(auVar4,auVar4);
              auVar202 = vfnmadd213ss_fma(auVar4,auVar182,ZEXT416(0x40000000));
              fVar130 = auVar4._0_4_ * auVar202._0_4_;
              auVar4 = vmaxss_avx(ZEXT416((uint)local_7c0._0_4_),
                                  ZEXT416((uint)(fVar133 * (float)local_620._0_4_)));
              uVar74 = CONCAT44(auVar214._4_4_,auVar214._0_4_);
              auVar232._0_8_ = uVar74 ^ 0x8000000080000000;
              auVar232._8_4_ = -auVar214._8_4_;
              auVar232._12_4_ = -auVar214._12_4_;
              local_860._0_4_ = fVar109 * auVar141._0_4_ * fVar130;
              local_860._4_4_ = fVar109 * auVar141._4_4_ * fVar130;
              local_860._8_4_ = fVar109 * auVar141._8_4_ * fVar130;
              local_860._12_4_ = fVar109 * auVar141._12_4_ * fVar130;
              local_840._0_4_ = auVar214._0_4_ * fVar109;
              local_840._4_4_ = auVar214._4_4_ * fVar109;
              local_840._8_4_ = auVar214._8_4_ * fVar109;
              local_840._12_4_ = auVar214._12_4_ * fVar109;
              local_920._0_16_ = auVar214;
              if (fVar131 < -fVar131) {
                local_a20._0_4_ = auVar90._0_4_;
                local_a40._0_16_ = auVar232;
                fVar109 = sqrtf(fVar131);
                auVar90 = ZEXT416((uint)local_a20._0_4_);
                auVar232 = local_a40._0_16_;
              }
              else {
                auVar182 = vsqrtss_avx(auVar182,auVar182);
                fVar109 = auVar182._0_4_;
              }
              local_a20._0_16_ = vdpps_avx(_local_7a0,local_840._0_16_,0x7f);
              auVar202 = vfmadd213ss_fma(ZEXT416((uint)local_7c0._0_4_),auVar90,
                                         ZEXT416((uint)auVar4._0_4_));
              auVar182 = vdpps_avx(auVar232,local_840._0_16_,0x7f);
              auVar141 = vdpps_avx(_local_7a0,local_860._0_16_,0x7f);
              local_860._0_16_ = vdpps_avx((undefined1  [16])aVar2,local_840._0_16_,0x7f);
              auVar90 = vfmadd213ss_fma(ZEXT416((uint)(auVar90._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_7c0._0_4_ / fVar109)),auVar202);
              local_a40._0_4_ = auVar90._0_4_;
              auVar91._0_4_ = local_a20._0_4_ * local_a20._0_4_;
              auVar91._4_4_ = local_a20._4_4_ * local_a20._4_4_;
              auVar91._8_4_ = local_a20._8_4_ * local_a20._8_4_;
              auVar91._12_4_ = local_a20._12_4_ * local_a20._12_4_;
              auVar90 = vdpps_avx(_local_7a0,auVar232,0x7f);
              auVar220 = vsubps_avx(local_8a0._0_16_,auVar91);
              auVar202 = vrsqrtss_avx(auVar220,auVar220);
              fVar130 = auVar220._0_4_;
              fVar109 = auVar202._0_4_;
              fVar109 = fVar109 * 1.5 + fVar130 * -0.5 * fVar109 * fVar109 * fVar109;
              auVar202 = vdpps_avx(_local_7a0,(undefined1  [16])aVar2,0x7f);
              local_840._0_16_ = ZEXT416((uint)(auVar182._0_4_ + auVar141._0_4_));
              local_880._0_16_ = vfnmadd231ss_fma(auVar90,local_a20._0_16_,local_840._0_16_);
              auVar90 = vfnmadd231ss_fma(auVar202,local_a20._0_16_,local_860._0_16_);
              if (fVar130 < 0.0) {
                local_640._0_4_ = fVar109;
                local_660._0_16_ = auVar90;
                fVar130 = sqrtf(fVar130);
                fVar109 = (float)local_640._0_4_;
                auVar90 = local_660._0_16_;
              }
              else {
                auVar182 = vsqrtss_avx(auVar220,auVar220);
                fVar130 = auVar182._0_4_;
              }
              auVar254 = ZEXT3264(local_9a0);
              auVar261 = ZEXT3264(local_9c0);
              auVar267 = ZEXT3264(local_9e0);
              auVar231 = ZEXT3264(local_940);
              auVar234 = ZEXT3264(local_a00);
              auVar182 = vpermilps_avx(local_600._0_16_,0xff);
              fVar130 = fVar130 - auVar182._0_4_;
              auVar141 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xff);
              auVar182 = vfmsub213ss_fma(local_880._0_16_,ZEXT416((uint)fVar109),auVar141);
              auVar158._0_8_ = local_860._0_8_ ^ 0x8000000080000000;
              auVar158._8_4_ = local_860._8_4_ ^ 0x80000000;
              auVar158._12_4_ = local_860._12_4_ ^ 0x80000000;
              auVar183._0_8_ = auVar182._0_8_ ^ 0x8000000080000000;
              auVar183._8_4_ = auVar182._8_4_ ^ 0x80000000;
              auVar183._12_4_ = auVar182._12_4_ ^ 0x80000000;
              auVar223 = ZEXT1664(local_840._0_16_);
              auVar90 = ZEXT416((uint)(auVar90._0_4_ * fVar109));
              auVar182 = vfmsub231ss_fma(ZEXT416((uint)(local_860._0_4_ * auVar182._0_4_)),
                                         local_840._0_16_,auVar90);
              auVar90 = vinsertps_avx(auVar183,auVar90,0x1c);
              uVar83 = auVar182._0_4_;
              auVar184._4_4_ = uVar83;
              auVar184._0_4_ = uVar83;
              auVar184._8_4_ = uVar83;
              auVar184._12_4_ = uVar83;
              auVar90 = vdivps_avx(auVar90,auVar184);
              auVar182 = vinsertps_avx(local_840._0_16_,auVar158,0x10);
              auVar182 = vdivps_avx(auVar182,auVar184);
              fVar109 = local_a20._0_4_;
              auVar139._0_4_ = fVar109 * auVar90._0_4_ + fVar130 * auVar182._0_4_;
              auVar139._4_4_ = fVar109 * auVar90._4_4_ + fVar130 * auVar182._4_4_;
              auVar139._8_4_ = fVar109 * auVar90._8_4_ + fVar130 * auVar182._8_4_;
              auVar139._12_4_ = fVar109 * auVar90._12_4_ + fVar130 * auVar182._12_4_;
              auVar182 = vsubps_avx(auVar94,auVar139);
              auVar237 = ZEXT1664(auVar182);
              auVar90 = vandps_avx(local_a20._0_16_,local_700._0_16_);
              fVar131 = (float)local_800._4_4_;
              fVar132 = fStack_7f8;
              fVar135 = fStack_7f4;
              fVar133 = fStack_7f0;
              fVar134 = fStack_7ec;
              fVar196 = fStack_7e8;
              fVar109 = (float)local_800._0_4_;
              if (auVar90._0_4_ < (float)local_a40._0_4_) {
                auVar4 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a40._0_4_ + auVar4._0_4_)),
                                         local_820._0_16_,ZEXT416(0x36000000));
                auVar90 = vandps_avx(ZEXT416((uint)fVar130),local_700._0_16_);
                if (auVar90._0_4_ < auVar4._0_4_) {
                  fVar130 = auVar182._0_4_ + (float)local_770._0_4_;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar130) &&
                     (fVar208 = (ray->super_RayK<1>).tfar, fVar130 <= fVar208)) {
                    auVar90 = vmovshdup_avx(auVar182);
                    fVar209 = auVar90._0_4_;
                    if ((0.0 <= fVar209) && (fVar209 <= 1.0)) {
                      auVar90 = vrsqrtss_avx(local_8a0._0_16_,local_8a0._0_16_);
                      fVar210 = auVar90._0_4_;
                      pGVar8 = (context->scene->geometries).items[uVar80].ptr;
                      if ((pGVar8->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar210 = fVar210 * 1.5 +
                                  local_8a0._0_4_ * -0.5 * fVar210 * fVar210 * fVar210;
                        auVar159._0_4_ = fVar210 * (float)local_7a0._0_4_;
                        auVar159._4_4_ = fVar210 * (float)local_7a0._4_4_;
                        auVar159._8_4_ = fVar210 * fStack_798;
                        auVar159._12_4_ = fVar210 * fStack_794;
                        auVar202 = vfmadd213ps_fma(auVar141,auVar159,local_920._0_16_);
                        auVar90 = vshufps_avx(auVar159,auVar159,0xc9);
                        auVar4 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xc9);
                        auVar160._0_4_ = auVar159._0_4_ * auVar4._0_4_;
                        auVar160._4_4_ = auVar159._4_4_ * auVar4._4_4_;
                        auVar160._8_4_ = auVar159._8_4_ * auVar4._8_4_;
                        auVar160._12_4_ = auVar159._12_4_ * auVar4._12_4_;
                        auVar141 = vfmsub231ps_fma(auVar160,local_920._0_16_,auVar90);
                        auVar90 = vshufps_avx(auVar141,auVar141,0xc9);
                        auVar4 = vshufps_avx(auVar202,auVar202,0xc9);
                        auVar141 = vshufps_avx(auVar141,auVar141,0xd2);
                        auVar92._0_4_ = auVar202._0_4_ * auVar141._0_4_;
                        auVar92._4_4_ = auVar202._4_4_ * auVar141._4_4_;
                        auVar92._8_4_ = auVar202._8_4_ * auVar141._8_4_;
                        auVar92._12_4_ = auVar202._12_4_ * auVar141._12_4_;
                        auVar90 = vfmsub231ps_fma(auVar92,auVar90,auVar4);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar130;
                          auVar4 = vshufps_avx(auVar90,auVar90,0xe9);
                          uVar84 = vmovlps_avx(auVar4);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar84;
                          (ray->Ng).field_0.field_0.z = auVar90._0_4_;
                          ray->u = fVar209;
                          ray->v = 0.0;
                          ray->primID = local_8c0._0_4_;
                          ray->geomID = uVar80;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar4 = vshufps_avx(auVar90,auVar90,0xe9);
                          local_8f0 = vmovlps_avx(auVar4);
                          local_8e8 = auVar90._0_4_;
                          local_8e4 = fVar209;
                          local_8e0 = 0;
                          local_8dc = local_8c0._0_4_;
                          local_8d8 = uVar80;
                          local_8d4 = context->user->instID[0];
                          local_8d0 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar130;
                          local_5e0._0_4_ = 0xffffffff;
                          local_a78.valid = (int *)local_5e0;
                          local_a78.geometryUserPtr = pGVar8->userPtr;
                          local_a78.context = context->user;
                          local_a78.hit = (RTCHitN *)&local_8f0;
                          local_a78.N = 1;
                          local_a78.ray = (RTCRayN *)ray;
                          if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01869668:
                            p_Var13 = context->args->filter;
                            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar223 = ZEXT1664(auVar223._0_16_);
                              auVar237 = ZEXT1664(auVar237._0_16_);
                              (*p_Var13)(&local_a78);
                              if (*local_a78.valid == 0) goto LAB_018696fc;
                            }
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_a78.hit;
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_a78.hit + 4);
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_a78.hit + 8);
                            *(float *)((long)local_a78.ray + 0x3c) = *(float *)(local_a78.hit + 0xc)
                            ;
                            *(float *)((long)local_a78.ray + 0x40) =
                                 *(float *)(local_a78.hit + 0x10);
                            *(float *)((long)local_a78.ray + 0x44) =
                                 *(float *)(local_a78.hit + 0x14);
                            *(float *)((long)local_a78.ray + 0x48) =
                                 *(float *)(local_a78.hit + 0x18);
                            *(float *)((long)local_a78.ray + 0x4c) =
                                 *(float *)(local_a78.hit + 0x1c);
                            *(float *)((long)local_a78.ray + 0x50) =
                                 *(float *)(local_a78.hit + 0x20);
                          }
                          else {
                            auVar223 = ZEXT1664(local_840._0_16_);
                            auVar237 = ZEXT1664(auVar182);
                            (*pGVar8->intersectionFilterN)(&local_a78);
                            if (*local_a78.valid != 0) goto LAB_01869668;
LAB_018696fc:
                            (ray->super_RayK<1>).tfar = fVar208;
                          }
                          auVar254 = ZEXT3264(local_9a0);
                          auVar261 = ZEXT3264(local_9c0);
                          auVar267 = ZEXT3264(local_9e0);
                          auVar231 = ZEXT3264(local_940);
                          auVar234 = ZEXT3264(local_a00);
                          fVar109 = (float)local_800._0_4_;
                          fVar131 = (float)local_800._4_4_;
                          fVar132 = fStack_7f8;
                          fVar135 = fStack_7f4;
                          fVar133 = fStack_7f0;
                          fVar134 = fStack_7ec;
                          fVar196 = fStack_7e8;
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar79 = lVar79 + -1;
            } while (lVar79 != 0);
            auVar97 = local_460;
            fVar130 = (ray->super_RayK<1>).tfar;
            auVar105._4_4_ = fVar130;
            auVar105._0_4_ = fVar130;
            auVar105._8_4_ = fVar130;
            auVar105._12_4_ = fVar130;
            auVar105._16_4_ = fVar130;
            auVar105._20_4_ = fVar130;
            auVar105._24_4_ = fVar130;
            auVar105._28_4_ = fVar130;
            auVar127 = vcmpps_avx(_local_6e0,auVar105,2);
            local_460 = vandps_avx(auVar127,local_460);
            auVar128 = ZEXT3264(local_460);
            auVar97 = auVar97 & auVar127;
          } while ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar97 >> 0x7f,0) != '\0') ||
                     (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar97 >> 0xbf,0) != '\0') ||
                   (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar97[0x1f] < '\0');
          auVar128 = ZEXT3264(local_420);
          local_820 = local_420;
          auVar248 = ZEXT3264(local_560);
          auVar195 = _local_580;
          fVar130 = (float)local_5c0._0_4_;
          fVar208 = (float)local_5c0._4_4_;
          fVar209 = fStack_5b8;
          fVar210 = fStack_5b4;
          fVar211 = fStack_5b0;
          fVar212 = fStack_5ac;
          fVar213 = fStack_5a8;
          fVar175 = fStack_5a4;
        }
        auVar129._0_4_ = fVar109 * (float)local_5a0._0_4_;
        auVar129._4_4_ = fVar131 * (float)local_5a0._4_4_;
        auVar129._8_4_ = fVar132 * fStack_598;
        auVar129._12_4_ = fVar135 * fStack_594;
        auVar129._16_4_ = fVar133 * fStack_590;
        auVar129._20_4_ = fVar134 * fStack_58c;
        auVar129._28_36_ = auVar128._28_36_;
        auVar129._24_4_ = fVar196 * fStack_588;
        auVar90 = vfmadd213ps_fma(local_760,auVar195,auVar129._0_32_);
        auVar90 = vfmadd213ps_fma(local_740,auVar248._0_32_,ZEXT1632(auVar90));
        auVar127 = vandps_avx(ZEXT1632(auVar90),local_720);
        auVar149._8_4_ = 0x3e99999a;
        auVar149._0_8_ = 0x3e99999a3e99999a;
        auVar149._12_4_ = 0x3e99999a;
        auVar149._16_4_ = 0x3e99999a;
        auVar149._20_4_ = 0x3e99999a;
        auVar149._24_4_ = 0x3e99999a;
        auVar149._28_4_ = 0x3e99999a;
        auVar127 = vcmpps_avx(auVar127,auVar149,1);
        auVar97 = vorps_avx(auVar127,local_4e0);
        auVar150._0_4_ = (float)local_7e0._0_4_ + fVar130;
        auVar150._4_4_ = (float)local_7e0._4_4_ + fVar208;
        auVar150._8_4_ = fStack_7d8 + fVar209;
        auVar150._12_4_ = fStack_7d4 + fVar210;
        auVar150._16_4_ = fStack_7d0 + fVar211;
        auVar150._20_4_ = fStack_7cc + fVar212;
        auVar150._24_4_ = fStack_7c8 + fVar213;
        auVar150._28_4_ = fStack_7c4 + fVar175;
        auVar127 = vcmpps_avx(auVar150,auVar105,2);
        local_740 = vandps_avx(auVar127,local_4c0);
        auVar151._8_4_ = 3;
        auVar151._0_8_ = 0x300000003;
        auVar151._12_4_ = 3;
        auVar151._16_4_ = 3;
        auVar151._20_4_ = 3;
        auVar151._24_4_ = 3;
        auVar151._28_4_ = 3;
        auVar173._8_4_ = 2;
        auVar173._0_8_ = 0x200000002;
        auVar173._12_4_ = 2;
        auVar173._16_4_ = 2;
        auVar173._20_4_ = 2;
        auVar173._24_4_ = 2;
        auVar173._28_4_ = 2;
        auVar127 = vblendvps_avx(auVar173,auVar151,auVar97);
        local_760 = vpcmpgtd_avx2(auVar127,local_500);
        local_5e0 = vpandn_avx2(local_760,local_740);
        auVar127 = local_740 & ~local_760;
        if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar127 >> 0x7f,0) != '\0') ||
              (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar127 >> 0xbf,0) != '\0') ||
            (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar127[0x1f] < '\0') {
          auVar4 = vminps_avx(local_950,local_970);
          auVar90 = vmaxps_avx(local_950,local_970);
          auVar182 = vminps_avx(local_960,_local_980);
          auVar141 = vminps_avx(auVar4,auVar182);
          auVar4 = vmaxps_avx(local_960,_local_980);
          auVar182 = vmaxps_avx(auVar90,auVar4);
          local_880._8_4_ = 0x7fffffff;
          local_880._0_8_ = 0x7fffffff7fffffff;
          local_880._12_4_ = 0x7fffffff;
          auVar90 = vandps_avx(auVar141,local_880._0_16_);
          auVar4 = vandps_avx(auVar182,local_880._0_16_);
          auVar90 = vmaxps_avx(auVar90,auVar4);
          auVar4 = vmovshdup_avx(auVar90);
          auVar4 = vmaxss_avx(auVar4,auVar90);
          auVar90 = vshufpd_avx(auVar90,auVar90,1);
          auVar90 = vmaxss_avx(auVar90,auVar4);
          local_7c0._0_4_ = auVar90._0_4_ * 1.9073486e-06;
          local_660._0_16_ = vshufps_avx(auVar182,auVar182,0xff);
          local_6e0._4_4_ = (float)local_7e0._4_4_ + local_420._4_4_;
          local_6e0._0_4_ = (float)local_7e0._0_4_ + local_420._0_4_;
          fStack_6d8 = fStack_7d8 + local_420._8_4_;
          fStack_6d4 = fStack_7d4 + local_420._12_4_;
          fStack_6d0 = fStack_7d0 + local_420._16_4_;
          fStack_6cc = fStack_7cc + local_420._20_4_;
          fStack_6c8 = fStack_7c8 + local_420._24_4_;
          fStack_6c4 = fStack_7c4 + local_420._28_4_;
          local_820 = local_420;
          do {
            auVar107._8_4_ = 0x7f800000;
            auVar107._0_8_ = 0x7f8000007f800000;
            auVar107._12_4_ = 0x7f800000;
            auVar107._16_4_ = 0x7f800000;
            auVar107._20_4_ = 0x7f800000;
            auVar107._24_4_ = 0x7f800000;
            auVar107._28_4_ = 0x7f800000;
            auVar127 = vblendvps_avx(auVar107,local_820,local_5e0);
            auVar97 = vshufps_avx(auVar127,auVar127,0xb1);
            auVar97 = vminps_avx(auVar127,auVar97);
            auVar14 = vshufpd_avx(auVar97,auVar97,5);
            auVar97 = vminps_avx(auVar97,auVar14);
            auVar14 = vpermpd_avx2(auVar97,0x4e);
            auVar97 = vminps_avx(auVar97,auVar14);
            auVar97 = vcmpps_avx(auVar127,auVar97,0);
            auVar14 = local_5e0 & auVar97;
            auVar127 = local_5e0;
            if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0x7f,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0xbf,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar14[0x1f] < '\0') {
              auVar127 = vandps_avx(auVar97,local_5e0);
            }
            uVar76 = vmovmskps_avx(auVar127);
            iVar20 = 0;
            for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar77 = iVar20 << 2;
            *(undefined4 *)(local_5e0 + uVar77) = 0;
            aVar2 = (ray->super_RayK<1>).dir.field_0;
            local_8a0._0_16_ = (undefined1  [16])aVar2;
            auVar90 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            uVar76 = *(uint *)(local_1c0 + uVar77);
            uVar77 = *(uint *)(local_400 + uVar77);
            if (auVar90._0_4_ < 0.0) {
              fVar109 = sqrtf(auVar90._0_4_);
            }
            else {
              auVar90 = vsqrtss_avx(auVar90,auVar90);
              fVar109 = auVar90._0_4_;
            }
            local_700._0_4_ = fVar109 * 1.9073486e-06;
            auVar90 = vinsertps_avx(ZEXT416(uVar77),ZEXT416(uVar76),0x10);
            lVar79 = 5;
            do {
              auVar182 = vmovshdup_avx(auVar90);
              fVar135 = 1.0 - auVar182._0_4_;
              local_920._0_16_ = ZEXT416((uint)fVar135);
              auVar4 = vshufps_avx(auVar90,auVar90,0x55);
              fVar109 = auVar4._0_4_;
              auVar117._0_4_ = local_970._0_4_ * fVar109;
              fVar130 = auVar4._4_4_;
              auVar117._4_4_ = local_970._4_4_ * fVar130;
              fVar131 = auVar4._8_4_;
              auVar117._8_4_ = local_970._8_4_ * fVar131;
              fVar132 = auVar4._12_4_;
              auVar117._12_4_ = local_970._12_4_ * fVar132;
              auVar140._4_4_ = fVar135;
              auVar140._0_4_ = fVar135;
              auVar140._8_4_ = fVar135;
              auVar140._12_4_ = fVar135;
              auVar4 = vfmadd231ps_fma(auVar117,auVar140,local_950);
              auVar161._0_4_ = local_960._0_4_ * fVar109;
              auVar161._4_4_ = local_960._4_4_ * fVar130;
              auVar161._8_4_ = local_960._8_4_ * fVar131;
              auVar161._12_4_ = local_960._12_4_ * fVar132;
              auVar141 = vfmadd231ps_fma(auVar161,auVar140,local_970);
              auVar201._0_4_ = fVar109 * auVar141._0_4_;
              auVar201._4_4_ = fVar130 * auVar141._4_4_;
              auVar201._8_4_ = fVar131 * auVar141._8_4_;
              auVar201._12_4_ = fVar132 * auVar141._12_4_;
              auVar202 = vfmadd231ps_fma(auVar201,auVar140,auVar4);
              auVar118._0_4_ = fVar109 * (float)local_980._0_4_;
              auVar118._4_4_ = fVar130 * (float)local_980._4_4_;
              auVar118._8_4_ = fVar131 * fStack_978;
              auVar118._12_4_ = fVar132 * fStack_974;
              auVar4 = vfmadd231ps_fma(auVar118,auVar140,local_960);
              auVar185._0_4_ = fVar109 * auVar4._0_4_;
              auVar185._4_4_ = fVar130 * auVar4._4_4_;
              auVar185._8_4_ = fVar131 * auVar4._8_4_;
              auVar185._12_4_ = fVar132 * auVar4._12_4_;
              auVar141 = vfmadd231ps_fma(auVar185,auVar140,auVar141);
              fVar133 = auVar90._0_4_;
              auVar119._4_4_ = fVar133;
              auVar119._0_4_ = fVar133;
              auVar119._8_4_ = fVar133;
              auVar119._12_4_ = fVar133;
              auVar4 = vfmadd213ps_fma(auVar119,local_8a0._0_16_,_DAT_01f7aa10);
              auVar93._0_4_ = fVar109 * auVar141._0_4_;
              auVar93._4_4_ = fVar130 * auVar141._4_4_;
              auVar93._8_4_ = fVar131 * auVar141._8_4_;
              auVar93._12_4_ = fVar132 * auVar141._12_4_;
              auVar94 = vfmadd231ps_fma(auVar93,auVar202,auVar140);
              local_600._0_16_ = auVar94;
              auVar4 = vsubps_avx(auVar4,auVar94);
              _local_7a0 = auVar4;
              auVar4 = vdpps_avx(auVar4,auVar4,0x7f);
              fVar109 = auVar4._0_4_;
              if (fVar109 < 0.0) {
                local_920._0_16_ = ZEXT416((uint)fVar135);
                local_a20._0_16_ = auVar202;
                local_a40._0_16_ = auVar141;
                auVar261._0_4_ = sqrtf(fVar109);
                auVar261._4_60_ = extraout_var_00;
                auVar94 = auVar261._0_16_;
                auVar141 = local_a40._0_16_;
                auVar202 = local_a20._0_16_;
              }
              else {
                auVar94 = vsqrtss_avx(auVar4,auVar4);
              }
              auVar141 = vsubps_avx(auVar141,auVar202);
              auVar219._0_4_ = auVar141._0_4_ * 3.0;
              auVar219._4_4_ = auVar141._4_4_ * 3.0;
              auVar219._8_4_ = auVar141._8_4_ * 3.0;
              auVar219._12_4_ = auVar141._12_4_ * 3.0;
              auVar141 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_920._0_16_,auVar182);
              auVar202 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar182,local_920._0_16_);
              fVar130 = local_920._0_4_ * 6.0;
              fVar131 = auVar141._0_4_ * 6.0;
              fVar132 = auVar202._0_4_ * 6.0;
              fVar135 = auVar182._0_4_ * 6.0;
              auVar162._0_4_ = fVar135 * (float)local_980._0_4_;
              auVar162._4_4_ = fVar135 * (float)local_980._4_4_;
              auVar162._8_4_ = fVar135 * fStack_978;
              auVar162._12_4_ = fVar135 * fStack_974;
              auVar120._4_4_ = fVar132;
              auVar120._0_4_ = fVar132;
              auVar120._8_4_ = fVar132;
              auVar120._12_4_ = fVar132;
              auVar182 = vfmadd132ps_fma(auVar120,auVar162,local_960);
              auVar163._4_4_ = fVar131;
              auVar163._0_4_ = fVar131;
              auVar163._8_4_ = fVar131;
              auVar163._12_4_ = fVar131;
              auVar182 = vfmadd132ps_fma(auVar163,auVar182,local_970);
              auVar141 = vdpps_avx(auVar219,auVar219,0x7f);
              auVar121._4_4_ = fVar130;
              auVar121._0_4_ = fVar130;
              auVar121._8_4_ = fVar130;
              auVar121._12_4_ = fVar130;
              auVar220 = vfmadd132ps_fma(auVar121,auVar182,local_950);
              auVar182 = vblendps_avx(auVar141,_DAT_01f7aa10,0xe);
              auVar202 = vrsqrtss_avx(auVar182,auVar182);
              fVar132 = auVar141._0_4_;
              fVar130 = auVar202._0_4_;
              auVar202 = vdpps_avx(auVar219,auVar220,0x7f);
              fVar130 = fVar130 * 1.5 + fVar132 * -0.5 * fVar130 * fVar130 * fVar130;
              auVar122._0_4_ = auVar220._0_4_ * fVar132;
              auVar122._4_4_ = auVar220._4_4_ * fVar132;
              auVar122._8_4_ = auVar220._8_4_ * fVar132;
              auVar122._12_4_ = auVar220._12_4_ * fVar132;
              fVar131 = auVar202._0_4_;
              auVar203._0_4_ = auVar219._0_4_ * fVar131;
              auVar203._4_4_ = auVar219._4_4_ * fVar131;
              auVar203._8_4_ = auVar219._8_4_ * fVar131;
              auVar203._12_4_ = auVar219._12_4_ * fVar131;
              auVar202 = vsubps_avx(auVar122,auVar203);
              auVar182 = vrcpss_avx(auVar182,auVar182);
              auVar220 = vfnmadd213ss_fma(auVar182,auVar141,ZEXT416(0x40000000));
              fVar131 = auVar182._0_4_ * auVar220._0_4_;
              auVar182 = vmaxss_avx(ZEXT416((uint)local_7c0._0_4_),
                                    ZEXT416((uint)(fVar133 * (float)local_700._0_4_)));
              uVar74 = CONCAT44(auVar219._4_4_,auVar219._0_4_);
              auVar236._0_8_ = uVar74 ^ 0x8000000080000000;
              auVar236._8_4_ = -auVar219._8_4_;
              auVar236._12_4_ = -auVar219._12_4_;
              local_860._0_4_ = fVar130 * auVar202._0_4_ * fVar131;
              local_860._4_4_ = fVar130 * auVar202._4_4_ * fVar131;
              local_860._8_4_ = fVar130 * auVar202._8_4_ * fVar131;
              local_860._12_4_ = fVar130 * auVar202._12_4_ * fVar131;
              local_840._0_4_ = auVar219._0_4_ * fVar130;
              local_840._4_4_ = auVar219._4_4_ * fVar130;
              local_840._8_4_ = auVar219._8_4_ * fVar130;
              local_840._12_4_ = auVar219._12_4_ * fVar130;
              local_920._0_16_ = auVar219;
              if (fVar132 < -fVar132) {
                local_a20._0_4_ = auVar94._0_4_;
                local_a40._0_16_ = auVar236;
                fVar130 = sqrtf(fVar132);
                auVar94 = ZEXT416((uint)local_a20._0_4_);
                auVar236 = local_a40._0_16_;
              }
              else {
                auVar141 = vsqrtss_avx(auVar141,auVar141);
                fVar130 = auVar141._0_4_;
              }
              local_a20._0_16_ = vdpps_avx(_local_7a0,local_840._0_16_,0x7f);
              auVar220 = vfmadd213ss_fma(ZEXT416((uint)local_7c0._0_4_),auVar94,
                                         ZEXT416((uint)auVar182._0_4_));
              auVar141 = vdpps_avx(auVar236,local_840._0_16_,0x7f);
              auVar202 = vdpps_avx(_local_7a0,local_860._0_16_,0x7f);
              local_840._0_16_ = vdpps_avx(local_8a0._0_16_,local_840._0_16_,0x7f);
              auVar94 = vfmadd213ss_fma(ZEXT416((uint)(auVar94._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_7c0._0_4_ / fVar130)),auVar220);
              local_a40._0_4_ = auVar94._0_4_;
              fVar130 = auVar141._0_4_ + auVar202._0_4_;
              auVar223 = ZEXT464((uint)fVar130);
              auVar95._0_4_ = local_a20._0_4_ * local_a20._0_4_;
              auVar95._4_4_ = local_a20._4_4_ * local_a20._4_4_;
              auVar95._8_4_ = local_a20._8_4_ * local_a20._8_4_;
              auVar95._12_4_ = local_a20._12_4_ * local_a20._12_4_;
              auVar141 = vdpps_avx(_local_7a0,auVar236,0x7f);
              auVar94 = vsubps_avx(auVar4,auVar95);
              auVar202 = vrsqrtss_avx(auVar94,auVar94);
              fVar132 = auVar94._0_4_;
              fVar131 = auVar202._0_4_;
              fVar131 = fVar131 * 1.5 + fVar132 * -0.5 * fVar131 * fVar131 * fVar131;
              auVar202 = vdpps_avx(_local_7a0,local_8a0._0_16_,0x7f);
              local_860._0_16_ = vfnmadd231ss_fma(auVar141,local_a20._0_16_,ZEXT416((uint)fVar130));
              auVar141 = vfnmadd231ss_fma(auVar202,local_a20._0_16_,local_840._0_16_);
              if (fVar132 < 0.0) {
                local_620._0_16_ = ZEXT416((uint)fVar130);
                local_800._0_4_ = fVar131;
                local_640._0_16_ = auVar141;
                fVar130 = sqrtf(fVar132);
                auVar223 = ZEXT1664(local_620._0_16_);
                fVar131 = (float)local_800._0_4_;
                auVar141 = local_640._0_16_;
              }
              else {
                auVar202 = vsqrtss_avx(auVar94,auVar94);
                fVar130 = auVar202._0_4_;
              }
              auVar248 = ZEXT1664(auVar4);
              auVar254 = ZEXT3264(local_9a0);
              auVar261 = ZEXT3264(local_9c0);
              auVar267 = ZEXT3264(local_9e0);
              auVar231 = ZEXT3264(local_940);
              auVar234 = ZEXT3264(local_a00);
              auVar237 = ZEXT1664(local_920._0_16_);
              auVar202 = vpermilps_avx(local_600._0_16_,0xff);
              fVar130 = fVar130 - auVar202._0_4_;
              auVar94 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xff);
              auVar202 = vfmsub213ss_fma(local_860._0_16_,ZEXT416((uint)fVar131),auVar94);
              auVar164._0_8_ = local_840._0_8_ ^ 0x8000000080000000;
              auVar164._8_4_ = local_840._8_4_ ^ 0x80000000;
              auVar164._12_4_ = local_840._12_4_ ^ 0x80000000;
              auVar186._0_8_ = auVar202._0_8_ ^ 0x8000000080000000;
              auVar186._8_4_ = auVar202._8_4_ ^ 0x80000000;
              auVar186._12_4_ = auVar202._12_4_ ^ 0x80000000;
              auVar141 = ZEXT416((uint)(auVar141._0_4_ * fVar131));
              auVar220 = auVar223._0_16_;
              auVar202 = vfmsub231ss_fma(ZEXT416((uint)(auVar202._0_4_ * local_840._0_4_)),auVar220,
                                         auVar141);
              auVar141 = vinsertps_avx(auVar186,auVar141,0x1c);
              uVar83 = auVar202._0_4_;
              auVar187._4_4_ = uVar83;
              auVar187._0_4_ = uVar83;
              auVar187._8_4_ = uVar83;
              auVar187._12_4_ = uVar83;
              auVar141 = vdivps_avx(auVar141,auVar187);
              auVar202 = vinsertps_avx(auVar220,auVar164,0x10);
              auVar202 = vdivps_avx(auVar202,auVar187);
              fVar131 = local_a20._0_4_;
              auVar142._0_4_ = fVar131 * auVar141._0_4_ + fVar130 * auVar202._0_4_;
              auVar142._4_4_ = fVar131 * auVar141._4_4_ + fVar130 * auVar202._4_4_;
              auVar142._8_4_ = fVar131 * auVar141._8_4_ + fVar130 * auVar202._8_4_;
              auVar142._12_4_ = fVar131 * auVar141._12_4_ + fVar130 * auVar202._12_4_;
              auVar90 = vsubps_avx(auVar90,auVar142);
              auVar141 = vandps_avx(local_a20._0_16_,local_880._0_16_);
              if (auVar141._0_4_ < (float)local_a40._0_4_) {
                auVar141 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a40._0_4_ + auVar182._0_4_)),
                                           local_660._0_16_,ZEXT416(0x36000000));
                auVar182 = vandps_avx(ZEXT416((uint)fVar130),local_880._0_16_);
                if (auVar182._0_4_ < auVar141._0_4_) {
                  fVar130 = auVar90._0_4_ + (float)local_770._0_4_;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar130) &&
                     (fVar131 = (ray->super_RayK<1>).tfar, fVar130 <= fVar131)) {
                    auVar90 = vmovshdup_avx(auVar90);
                    fVar132 = auVar90._0_4_;
                    if ((0.0 <= fVar132) && (fVar132 <= 1.0)) {
                      auVar90 = vrsqrtss_avx(auVar4,auVar4);
                      fVar135 = auVar90._0_4_;
                      pGVar8 = (context->scene->geometries).items[uVar80].ptr;
                      if ((pGVar8->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar109 = fVar135 * 1.5 + fVar109 * -0.5 * fVar135 * fVar135 * fVar135;
                        auVar165._0_4_ = fVar109 * (float)local_7a0._0_4_;
                        auVar165._4_4_ = fVar109 * (float)local_7a0._4_4_;
                        auVar165._8_4_ = fVar109 * fStack_798;
                        auVar165._12_4_ = fVar109 * fStack_794;
                        auVar202 = vfmadd213ps_fma(auVar94,auVar165,local_920._0_16_);
                        auVar90 = vshufps_avx(auVar165,auVar165,0xc9);
                        auVar182 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xc9);
                        auVar166._0_4_ = auVar165._0_4_ * auVar182._0_4_;
                        auVar166._4_4_ = auVar165._4_4_ * auVar182._4_4_;
                        auVar166._8_4_ = auVar165._8_4_ * auVar182._8_4_;
                        auVar166._12_4_ = auVar165._12_4_ * auVar182._12_4_;
                        auVar141 = vfmsub231ps_fma(auVar166,local_920._0_16_,auVar90);
                        auVar90 = vshufps_avx(auVar141,auVar141,0xc9);
                        auVar182 = vshufps_avx(auVar202,auVar202,0xc9);
                        auVar141 = vshufps_avx(auVar141,auVar141,0xd2);
                        auVar96._0_4_ = auVar202._0_4_ * auVar141._0_4_;
                        auVar96._4_4_ = auVar202._4_4_ * auVar141._4_4_;
                        auVar96._8_4_ = auVar202._8_4_ * auVar141._8_4_;
                        auVar96._12_4_ = auVar202._12_4_ * auVar141._12_4_;
                        auVar90 = vfmsub231ps_fma(auVar96,auVar90,auVar182);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar130;
                          auVar4 = vshufps_avx(auVar90,auVar90,0xe9);
                          uVar84 = vmovlps_avx(auVar4);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar84;
                          (ray->Ng).field_0.field_0.z = auVar90._0_4_;
                          ray->u = fVar132;
                          ray->v = 0.0;
                          ray->primID = local_8c0._0_4_;
                          ray->geomID = uVar80;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          auVar182 = vshufps_avx(auVar90,auVar90,0xe9);
                          local_8f0 = vmovlps_avx(auVar182);
                          local_8e8 = auVar90._0_4_;
                          local_8e4 = fVar132;
                          local_8e0 = 0;
                          local_8dc = local_8c0._0_4_;
                          local_8d8 = uVar80;
                          local_8d4 = context->user->instID[0];
                          local_8d0 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar130;
                          local_a44 = -1;
                          local_a78.valid = &local_a44;
                          local_a78.geometryUserPtr = pGVar8->userPtr;
                          local_a78.context = context->user;
                          local_a78.hit = (RTCHitN *)&local_8f0;
                          local_a78.N = 1;
                          local_a78.ray = (RTCRayN *)ray;
                          if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0186a0b3:
                            p_Var13 = context->args->filter;
                            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar223 = ZEXT1664(auVar223._0_16_);
                              auVar237 = ZEXT1664(auVar237._0_16_);
                              auVar248 = ZEXT1664(auVar248._0_16_);
                              (*p_Var13)(&local_a78);
                              if (*local_a78.valid == 0) goto LAB_0186a147;
                            }
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_a78.hit;
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_a78.hit + 4);
                            (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_a78.hit + 8);
                            *(float *)((long)local_a78.ray + 0x3c) = *(float *)(local_a78.hit + 0xc)
                            ;
                            *(float *)((long)local_a78.ray + 0x40) =
                                 *(float *)(local_a78.hit + 0x10);
                            *(float *)((long)local_a78.ray + 0x44) =
                                 *(float *)(local_a78.hit + 0x14);
                            *(float *)((long)local_a78.ray + 0x48) =
                                 *(float *)(local_a78.hit + 0x18);
                            *(float *)((long)local_a78.ray + 0x4c) =
                                 *(float *)(local_a78.hit + 0x1c);
                            *(float *)((long)local_a78.ray + 0x50) =
                                 *(float *)(local_a78.hit + 0x20);
                          }
                          else {
                            auVar223 = ZEXT1664(auVar220);
                            auVar237 = ZEXT1664(local_920._0_16_);
                            auVar248 = ZEXT1664(auVar4);
                            (*pGVar8->intersectionFilterN)(&local_a78);
                            if (*local_a78.valid != 0) goto LAB_0186a0b3;
LAB_0186a147:
                            (ray->super_RayK<1>).tfar = fVar131;
                          }
                          auVar254 = ZEXT3264(local_9a0);
                          auVar261 = ZEXT3264(local_9c0);
                          auVar267 = ZEXT3264(local_9e0);
                          auVar231 = ZEXT3264(local_940);
                          auVar234 = ZEXT3264(local_a00);
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar79 = lVar79 + -1;
            } while (lVar79 != 0);
            auVar97 = local_5e0;
            fVar109 = (ray->super_RayK<1>).tfar;
            auVar105._4_4_ = fVar109;
            auVar105._0_4_ = fVar109;
            auVar105._8_4_ = fVar109;
            auVar105._12_4_ = fVar109;
            auVar105._16_4_ = fVar109;
            auVar105._20_4_ = fVar109;
            auVar105._24_4_ = fVar109;
            auVar105._28_4_ = fVar109;
            auVar127 = vcmpps_avx(_local_6e0,auVar105,2);
            local_5e0 = vandps_avx(auVar127,local_5e0);
            auVar97 = auVar97 & auVar127;
          } while ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar97 >> 0x7f,0) != '\0') ||
                     (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar97 >> 0xbf,0) != '\0') ||
                   (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar97[0x1f] < '\0');
        }
        auVar152._0_4_ = (float)local_7e0._0_4_ + local_3e0._0_4_;
        auVar152._4_4_ = (float)local_7e0._4_4_ + local_3e0._4_4_;
        auVar152._8_4_ = fStack_7d8 + local_3e0._8_4_;
        auVar152._12_4_ = fStack_7d4 + local_3e0._12_4_;
        auVar152._16_4_ = fStack_7d0 + local_3e0._16_4_;
        auVar152._20_4_ = fStack_7cc + local_3e0._20_4_;
        auVar152._24_4_ = fStack_7c8 + local_3e0._24_4_;
        auVar152._28_4_ = fStack_7c4 + local_3e0._28_4_;
        auVar97 = vcmpps_avx(auVar152,auVar105,2);
        auVar127 = vandps_avx(local_4a0,local_480);
        auVar127 = vandps_avx(auVar97,auVar127);
        auVar174._0_4_ = (float)local_7e0._0_4_ + local_420._0_4_;
        auVar174._4_4_ = (float)local_7e0._4_4_ + local_420._4_4_;
        auVar174._8_4_ = fStack_7d8 + local_420._8_4_;
        auVar174._12_4_ = fStack_7d4 + local_420._12_4_;
        auVar174._16_4_ = fStack_7d0 + local_420._16_4_;
        auVar174._20_4_ = fStack_7cc + local_420._20_4_;
        auVar174._24_4_ = fStack_7c8 + local_420._24_4_;
        auVar174._28_4_ = fStack_7c4 + local_420._28_4_;
        auVar14 = vcmpps_avx(auVar174,auVar105,2);
        auVar97 = vandps_avx(local_760,local_740);
        auVar97 = vandps_avx(auVar14,auVar97);
        auVar97 = vorps_avx(auVar127,auVar97);
        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar97 >> 0x7f,0) != '\0') ||
              (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar97 >> 0xbf,0) != '\0') ||
            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar97[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar82 * 0x60) = auVar97;
          auVar127 = vblendvps_avx(local_420,local_3e0,auVar127);
          *(undefined1 (*) [32])(auStack_160 + uVar82 * 0x60) = auVar127;
          uVar84 = vmovlps_avx(local_430);
          (&uStack_140)[uVar82 * 0xc] = uVar84;
          aiStack_138[uVar82 * 0x18] = local_aec + 1;
          iVar81 = iVar81 + 1;
        }
      }
    }
    fVar109 = (ray->super_RayK<1>).tfar;
    auVar102._4_4_ = fVar109;
    auVar102._0_4_ = fVar109;
    auVar102._8_4_ = fVar109;
    auVar102._12_4_ = fVar109;
    auVar102._16_4_ = fVar109;
    auVar102._20_4_ = fVar109;
    auVar102._24_4_ = fVar109;
    auVar102._28_4_ = fVar109;
    if (iVar81 == 0) break;
    uVar76 = -iVar81;
    pauVar75 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar81 - 1) * 0x60);
    fVar109 = (float)local_7e0._0_4_;
    fVar130 = (float)local_7e0._4_4_;
    fVar131 = fStack_7d8;
    fVar132 = fStack_7d4;
    fVar135 = fStack_7d0;
    fVar133 = fStack_7cc;
    fVar134 = fStack_7c8;
    fVar196 = fStack_7c4;
    while( true ) {
      auVar127 = pauVar75[1];
      auVar123._0_4_ = fVar109 + auVar127._0_4_;
      auVar123._4_4_ = fVar130 + auVar127._4_4_;
      auVar123._8_4_ = fVar131 + auVar127._8_4_;
      auVar123._12_4_ = fVar132 + auVar127._12_4_;
      auVar123._16_4_ = fVar135 + auVar127._16_4_;
      auVar123._20_4_ = fVar133 + auVar127._20_4_;
      auVar123._24_4_ = fVar134 + auVar127._24_4_;
      auVar123._28_4_ = fVar196 + auVar127._28_4_;
      auVar14 = vcmpps_avx(auVar123,auVar102,2);
      auVar97 = vandps_avx(auVar14,*pauVar75);
      local_3e0 = auVar97;
      auVar14 = *pauVar75 & auVar14;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') break;
      pauVar75 = pauVar75 + -3;
      uVar76 = uVar76 + 1;
      fVar109 = (float)local_7e0._0_4_;
      fVar130 = (float)local_7e0._4_4_;
      fVar131 = fStack_7d8;
      fVar132 = fStack_7d4;
      fVar135 = fStack_7d0;
      fVar133 = fStack_7cc;
      fVar134 = fStack_7c8;
      fVar196 = fStack_7c4;
      if (uVar76 == 0) goto LAB_0186a304;
    }
    auVar103._8_4_ = 0x7f800000;
    auVar103._0_8_ = 0x7f8000007f800000;
    auVar103._12_4_ = 0x7f800000;
    auVar103._16_4_ = 0x7f800000;
    auVar103._20_4_ = 0x7f800000;
    auVar103._24_4_ = 0x7f800000;
    auVar103._28_4_ = 0x7f800000;
    auVar127 = vblendvps_avx(auVar103,auVar127,auVar97);
    auVar14 = vshufps_avx(auVar127,auVar127,0xb1);
    auVar14 = vminps_avx(auVar127,auVar14);
    auVar147 = vshufpd_avx(auVar14,auVar14,5);
    auVar14 = vminps_avx(auVar14,auVar147);
    auVar147 = vpermpd_avx2(auVar14,0x4e);
    auVar14 = vminps_avx(auVar14,auVar147);
    auVar127 = vcmpps_avx(auVar127,auVar14,0);
    auVar14 = auVar97 & auVar127;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar97 = vandps_avx(auVar127,auVar97);
    }
    uVar74 = *(ulong *)pauVar75[2];
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar74;
    uVar77 = vmovmskps_avx(auVar97);
    iVar81 = 0;
    for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
      iVar81 = iVar81 + 1;
    }
    *(undefined4 *)(local_3e0 + (uint)(iVar81 << 2)) = 0;
    uVar77 = ~uVar76;
    if ((((((((local_3e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_3e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_3e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_3e0 >> 0x7f,0) != '\0') ||
          (local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_3e0 >> 0xbf,0) != '\0') ||
        (local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_3e0[0x1f] < '\0') {
      uVar77 = -uVar76;
    }
    uVar82 = (ulong)uVar77;
    local_aec = *(int *)(pauVar75[2] + 8);
    *pauVar75 = local_3e0;
    uVar83 = (undefined4)uVar74;
    auVar124._4_4_ = uVar83;
    auVar124._0_4_ = uVar83;
    auVar124._8_4_ = uVar83;
    auVar124._12_4_ = uVar83;
    auVar124._16_4_ = uVar83;
    auVar124._20_4_ = uVar83;
    auVar124._24_4_ = uVar83;
    auVar124._28_4_ = uVar83;
    auVar90 = vmovshdup_avx(auVar88);
    auVar90 = vsubps_avx(auVar90,auVar88);
    auVar104._0_4_ = auVar90._0_4_;
    auVar104._4_4_ = auVar104._0_4_;
    auVar104._8_4_ = auVar104._0_4_;
    auVar104._12_4_ = auVar104._0_4_;
    auVar104._16_4_ = auVar104._0_4_;
    auVar104._20_4_ = auVar104._0_4_;
    auVar104._24_4_ = auVar104._0_4_;
    auVar104._28_4_ = auVar104._0_4_;
    auVar90 = vfmadd132ps_fma(auVar104,auVar124,_DAT_01faff20);
    local_420 = ZEXT1632(auVar90);
    local_430._8_8_ = 0;
    local_430._0_8_ = *(ulong *)(local_420 + (uint)(iVar81 << 2));
    uVar74 = local_8c0._0_8_;
  } while( true );
LAB_0186a304:
  auVar127 = vcmpps_avx(local_320,auVar102,2);
  uVar80 = vmovmskps_avx(auVar127);
  uVar73 = uVar80 & uVar73 - 1 & uVar73;
  if (uVar73 == 0) {
    return;
  }
  goto LAB_01867cff;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }